

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_16,_16777232,_false,_embree::avx512::SubdivPatch1MBIntersectorK<16>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  RayK<16> *pRVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [32];
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  size_t k;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  GridSOA *pGVar46;
  GridSOA *pGVar47;
  byte bVar48;
  bool bVar49;
  uint uVar50;
  uint uVar51;
  AABBNodeMB4D *node1;
  ulong uVar52;
  ushort uVar53;
  long lVar54;
  long lVar55;
  NodeRef root;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  undefined1 (*pauVar59) [64];
  ulong *puVar60;
  undefined4 uVar61;
  long lVar62;
  Primitive_conflict3 *prim;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  int iVar67;
  undefined1 auVar68 [16];
  int iVar113;
  int iVar114;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  int iVar115;
  int iVar127;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar128 [64];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM29 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  vint<16> vitime;
  TravRayK<16,_false> tray;
  NodeRef stack_node [241];
  vfloat<16> stack_near [241];
  uint local_53a4;
  uint local_539c;
  Precalculations local_5358;
  undefined1 (*local_5348) [32];
  GridSOA *local_5340;
  GridSOA *local_5338;
  RTCFilterFunctionNArguments local_5330;
  BVH *local_5300;
  Intersectors *local_52f8;
  GridSOA *local_52f0;
  GridSOA *local_52e8;
  GridSOA *local_52e0;
  GridSOA *local_52d8;
  GridSOA *local_52d0;
  GridSOA *local_52c8;
  GridSOA *local_52c0;
  GridSOA *local_52b8;
  GridSOA *local_52b0;
  long local_52a8;
  GridSOA *local_52a0;
  long local_5298;
  GridSOA *local_5290;
  GridSOA *local_5288;
  GridSOA *local_5280;
  GridSOA *local_5278;
  GridSOA *local_5270;
  GridSOA *local_5268;
  GridSOA *local_5260;
  GridSOA *local_5258;
  GridSOA *local_5250;
  GridSOA *local_5248;
  undefined1 local_5240 [64];
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  undefined1 local_5140 [64];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 uStack_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 uStack_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 uStack_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  undefined1 local_4f00 [64];
  undefined1 local_4ec0 [64];
  undefined1 local_4e80 [64];
  undefined1 local_4e40 [64];
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 uStack_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined1 local_4dc0 [64];
  undefined1 local_4d80 [64];
  undefined1 local_4d40 [64];
  undefined1 local_4d00 [64];
  undefined1 local_4cc0 [64];
  undefined1 local_4c80 [64];
  undefined1 local_4c40 [64];
  undefined1 local_4c00 [64];
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [64];
  undefined1 local_4b40 [64];
  undefined1 local_4b00 [64];
  undefined1 local_4ac0 [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_48c0;
  undefined1 local_4800 [64];
  undefined1 local_47c0 [64];
  undefined1 local_4780 [64];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined1 local_46c0 [64];
  undefined1 local_4680 [64];
  undefined1 local_4640 [64];
  undefined1 local_4600 [64];
  undefined1 local_45c0 [64];
  undefined1 local_4580 [64];
  undefined1 local_4540 [64];
  uint local_4500;
  uint uStack_44fc;
  uint uStack_44f8;
  uint uStack_44f4;
  uint uStack_44f0;
  uint uStack_44ec;
  uint uStack_44e8;
  uint uStack_44e4;
  uint uStack_44e0;
  uint uStack_44dc;
  uint uStack_44d8;
  uint uStack_44d4;
  uint uStack_44d0;
  uint uStack_44cc;
  uint uStack_44c8;
  uint uStack_44c4;
  uint local_44c0;
  uint uStack_44bc;
  uint uStack_44b8;
  uint uStack_44b4;
  uint uStack_44b0;
  uint uStack_44ac;
  uint uStack_44a8;
  uint uStack_44a4;
  uint uStack_44a0;
  uint uStack_449c;
  uint uStack_4498;
  uint uStack_4494;
  uint uStack_4490;
  uint uStack_448c;
  uint uStack_4488;
  uint uStack_4484;
  undefined8 local_4450;
  size_t local_4448;
  ulong local_4440 [240];
  undefined1 local_3cc0 [64];
  uint local_3c80;
  uint uStack_3c7c;
  uint uStack_3c78;
  uint uStack_3c74;
  uint uStack_3c70;
  uint uStack_3c6c;
  uint uStack_3c68;
  uint uStack_3c64;
  uint uStack_3c60;
  uint uStack_3c5c;
  uint uStack_3c58;
  uint uStack_3c54;
  uint uStack_3c50;
  uint uStack_3c4c;
  uint uStack_3c48;
  uint uStack_3c44;
  undefined1 local_3c40 [15376];
  
  local_5300 = (BVH *)This->ptr;
  local_4448 = (local_5300->root).ptr;
  if (local_4448 != 8) {
    auVar69 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar64 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar128,5);
    uVar52 = vpcmpeqd_avx512f(auVar69,(undefined1  [64])valid_i->field_0);
    uVar64 = uVar64 & uVar52;
    if ((ushort)uVar64 != 0) {
      local_5358.super_Precalculations.grid = (GridSOA *)0x0;
      local_48c0.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_48c0.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_48c0.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_4800 = *(undefined1 (*) [64])(ray + 0x100);
      local_47c0 = *(undefined1 (*) [64])(ray + 0x140);
      local_4780 = *(undefined1 (*) [64])(ray + 0x180);
      auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar69 = vandps_avx512dq(local_4800,auVar70);
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar52 = vcmpps_avx512f(auVar69,auVar71,1);
      bVar49 = (bool)((byte)uVar52 & 1);
      iVar67 = auVar71._0_4_;
      auVar69._0_4_ = (uint)bVar49 * iVar67 | (uint)!bVar49 * local_4800._0_4_;
      bVar49 = (bool)((byte)(uVar52 >> 1) & 1);
      iVar113 = auVar71._4_4_;
      auVar69._4_4_ = (uint)bVar49 * iVar113 | (uint)!bVar49 * local_4800._4_4_;
      bVar49 = (bool)((byte)(uVar52 >> 2) & 1);
      iVar114 = auVar71._8_4_;
      auVar69._8_4_ = (uint)bVar49 * iVar114 | (uint)!bVar49 * local_4800._8_4_;
      bVar49 = (bool)((byte)(uVar52 >> 3) & 1);
      iVar115 = auVar71._12_4_;
      auVar69._12_4_ = (uint)bVar49 * iVar115 | (uint)!bVar49 * local_4800._12_4_;
      bVar49 = (bool)((byte)(uVar52 >> 4) & 1);
      iVar116 = auVar71._16_4_;
      auVar69._16_4_ = (uint)bVar49 * iVar116 | (uint)!bVar49 * local_4800._16_4_;
      bVar49 = (bool)((byte)(uVar52 >> 5) & 1);
      iVar117 = auVar71._20_4_;
      auVar69._20_4_ = (uint)bVar49 * iVar117 | (uint)!bVar49 * local_4800._20_4_;
      bVar49 = (bool)((byte)(uVar52 >> 6) & 1);
      iVar118 = auVar71._24_4_;
      auVar69._24_4_ = (uint)bVar49 * iVar118 | (uint)!bVar49 * local_4800._24_4_;
      bVar49 = (bool)((byte)(uVar52 >> 7) & 1);
      iVar119 = auVar71._28_4_;
      auVar69._28_4_ = (uint)bVar49 * iVar119 | (uint)!bVar49 * local_4800._28_4_;
      bVar49 = (bool)((byte)(uVar52 >> 8) & 1);
      iVar120 = auVar71._32_4_;
      auVar69._32_4_ = (uint)bVar49 * iVar120 | (uint)!bVar49 * local_4800._32_4_;
      bVar49 = (bool)((byte)(uVar52 >> 9) & 1);
      iVar121 = auVar71._36_4_;
      auVar69._36_4_ = (uint)bVar49 * iVar121 | (uint)!bVar49 * local_4800._36_4_;
      bVar49 = (bool)((byte)(uVar52 >> 10) & 1);
      iVar122 = auVar71._40_4_;
      auVar69._40_4_ = (uint)bVar49 * iVar122 | (uint)!bVar49 * local_4800._40_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xb) & 1);
      iVar123 = auVar71._44_4_;
      auVar69._44_4_ = (uint)bVar49 * iVar123 | (uint)!bVar49 * local_4800._44_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xc) & 1);
      iVar124 = auVar71._48_4_;
      auVar69._48_4_ = (uint)bVar49 * iVar124 | (uint)!bVar49 * local_4800._48_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xd) & 1);
      iVar125 = auVar71._52_4_;
      auVar69._52_4_ = (uint)bVar49 * iVar125 | (uint)!bVar49 * local_4800._52_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xe) & 1);
      iVar126 = auVar71._56_4_;
      iVar127 = auVar71._60_4_;
      auVar69._56_4_ = (uint)bVar49 * iVar126 | (uint)!bVar49 * local_4800._56_4_;
      bVar49 = SUB81(uVar52 >> 0xf,0);
      auVar69._60_4_ = (uint)bVar49 * iVar127 | (uint)!bVar49 * local_4800._60_4_;
      auVar72 = vandps_avx512dq(local_47c0,auVar70);
      uVar52 = vcmpps_avx512f(auVar72,auVar71,1);
      bVar49 = (bool)((byte)uVar52 & 1);
      auVar72._0_4_ = (uint)bVar49 * iVar67 | (uint)!bVar49 * local_47c0._0_4_;
      bVar49 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar72._4_4_ = (uint)bVar49 * iVar113 | (uint)!bVar49 * local_47c0._4_4_;
      bVar49 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar72._8_4_ = (uint)bVar49 * iVar114 | (uint)!bVar49 * local_47c0._8_4_;
      bVar49 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar72._12_4_ = (uint)bVar49 * iVar115 | (uint)!bVar49 * local_47c0._12_4_;
      bVar49 = (bool)((byte)(uVar52 >> 4) & 1);
      auVar72._16_4_ = (uint)bVar49 * iVar116 | (uint)!bVar49 * local_47c0._16_4_;
      bVar49 = (bool)((byte)(uVar52 >> 5) & 1);
      auVar72._20_4_ = (uint)bVar49 * iVar117 | (uint)!bVar49 * local_47c0._20_4_;
      bVar49 = (bool)((byte)(uVar52 >> 6) & 1);
      auVar72._24_4_ = (uint)bVar49 * iVar118 | (uint)!bVar49 * local_47c0._24_4_;
      bVar49 = (bool)((byte)(uVar52 >> 7) & 1);
      auVar72._28_4_ = (uint)bVar49 * iVar119 | (uint)!bVar49 * local_47c0._28_4_;
      bVar49 = (bool)((byte)(uVar52 >> 8) & 1);
      auVar72._32_4_ = (uint)bVar49 * iVar120 | (uint)!bVar49 * local_47c0._32_4_;
      bVar49 = (bool)((byte)(uVar52 >> 9) & 1);
      auVar72._36_4_ = (uint)bVar49 * iVar121 | (uint)!bVar49 * local_47c0._36_4_;
      bVar49 = (bool)((byte)(uVar52 >> 10) & 1);
      auVar72._40_4_ = (uint)bVar49 * iVar122 | (uint)!bVar49 * local_47c0._40_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xb) & 1);
      auVar72._44_4_ = (uint)bVar49 * iVar123 | (uint)!bVar49 * local_47c0._44_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xc) & 1);
      auVar72._48_4_ = (uint)bVar49 * iVar124 | (uint)!bVar49 * local_47c0._48_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xd) & 1);
      auVar72._52_4_ = (uint)bVar49 * iVar125 | (uint)!bVar49 * local_47c0._52_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xe) & 1);
      auVar72._56_4_ = (uint)bVar49 * iVar126 | (uint)!bVar49 * local_47c0._56_4_;
      bVar49 = SUB81(uVar52 >> 0xf,0);
      auVar72._60_4_ = (uint)bVar49 * iVar127 | (uint)!bVar49 * local_47c0._60_4_;
      auVar73 = vandps_avx512dq(local_4780,auVar70);
      uVar52 = vcmpps_avx512f(auVar73,auVar71,1);
      auVar71 = vrcp14ps_avx512f(auVar69);
      bVar49 = (bool)((byte)uVar52 & 1);
      auVar73._0_4_ = (uint)bVar49 * iVar67 | (uint)!bVar49 * local_4780._0_4_;
      bVar49 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar49 * iVar113 | (uint)!bVar49 * local_4780._4_4_;
      bVar49 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar49 * iVar114 | (uint)!bVar49 * local_4780._8_4_;
      bVar49 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar49 * iVar115 | (uint)!bVar49 * local_4780._12_4_;
      bVar49 = (bool)((byte)(uVar52 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar49 * iVar116 | (uint)!bVar49 * local_4780._16_4_;
      bVar49 = (bool)((byte)(uVar52 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar49 * iVar117 | (uint)!bVar49 * local_4780._20_4_;
      bVar49 = (bool)((byte)(uVar52 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar49 * iVar118 | (uint)!bVar49 * local_4780._24_4_;
      bVar49 = (bool)((byte)(uVar52 >> 7) & 1);
      auVar73._28_4_ = (uint)bVar49 * iVar119 | (uint)!bVar49 * local_4780._28_4_;
      bVar49 = (bool)((byte)(uVar52 >> 8) & 1);
      auVar73._32_4_ = (uint)bVar49 * iVar120 | (uint)!bVar49 * local_4780._32_4_;
      bVar49 = (bool)((byte)(uVar52 >> 9) & 1);
      auVar73._36_4_ = (uint)bVar49 * iVar121 | (uint)!bVar49 * local_4780._36_4_;
      bVar49 = (bool)((byte)(uVar52 >> 10) & 1);
      auVar73._40_4_ = (uint)bVar49 * iVar122 | (uint)!bVar49 * local_4780._40_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xb) & 1);
      auVar73._44_4_ = (uint)bVar49 * iVar123 | (uint)!bVar49 * local_4780._44_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xc) & 1);
      auVar73._48_4_ = (uint)bVar49 * iVar124 | (uint)!bVar49 * local_4780._48_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xd) & 1);
      auVar73._52_4_ = (uint)bVar49 * iVar125 | (uint)!bVar49 * local_4780._52_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xe) & 1);
      auVar73._56_4_ = (uint)bVar49 * iVar126 | (uint)!bVar49 * local_4780._56_4_;
      bVar49 = SUB81(uVar52 >> 0xf,0);
      auVar73._60_4_ = (uint)bVar49 * iVar127 | (uint)!bVar49 * local_4780._60_4_;
      auVar74 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar75 = vrcp14ps_avx512f(auVar72);
      auVar69 = vfnmadd213ps_avx512f(auVar69,auVar71,auVar74);
      local_4740 = vfmadd132ps_avx512f(auVar69,auVar71,auVar71);
      auVar69 = vfnmadd213ps_avx512f(auVar72,auVar75,auVar74);
      auVar71 = vrcp14ps_avx512f(auVar73);
      local_4700 = vfmadd132ps_avx512f(auVar69,auVar75,auVar75);
      auVar69 = vfnmadd213ps_avx512f(auVar73,auVar71,auVar74);
      local_46c0 = vfmadd132ps_avx512f(auVar69,auVar71,auVar71);
      local_4680 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_4740)
      ;
      local_4640 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_4700);
      local_4600 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80),
                                  local_46c0);
      uVar52 = vcmpps_avx512f(local_4740,auVar128,1);
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x10));
      auVar71._4_4_ = (uint)((byte)(uVar52 >> 1) & 1) * auVar69._4_4_;
      auVar71._0_4_ = (uint)((byte)uVar52 & 1) * auVar69._0_4_;
      auVar71._8_4_ = (uint)((byte)(uVar52 >> 2) & 1) * auVar69._8_4_;
      auVar71._12_4_ = (uint)((byte)(uVar52 >> 3) & 1) * auVar69._12_4_;
      auVar71._16_4_ = (uint)((byte)(uVar52 >> 4) & 1) * auVar69._16_4_;
      auVar71._20_4_ = (uint)((byte)(uVar52 >> 5) & 1) * auVar69._20_4_;
      auVar71._24_4_ = (uint)((byte)(uVar52 >> 6) & 1) * auVar69._24_4_;
      auVar71._28_4_ = (uint)((byte)(uVar52 >> 7) & 1) * auVar69._28_4_;
      auVar71._32_4_ = (uint)((byte)(uVar52 >> 8) & 1) * auVar69._32_4_;
      auVar71._36_4_ = (uint)((byte)(uVar52 >> 9) & 1) * auVar69._36_4_;
      auVar71._40_4_ = (uint)((byte)(uVar52 >> 10) & 1) * auVar69._40_4_;
      auVar71._44_4_ = (uint)((byte)(uVar52 >> 0xb) & 1) * auVar69._44_4_;
      auVar71._48_4_ = (uint)((byte)(uVar52 >> 0xc) & 1) * auVar69._48_4_;
      auVar71._52_4_ = (uint)((byte)(uVar52 >> 0xd) & 1) * auVar69._52_4_;
      auVar71._56_4_ = (uint)((byte)(uVar52 >> 0xe) & 1) * auVar69._56_4_;
      auVar71._60_4_ = (uint)(byte)(uVar52 >> 0xf) * auVar69._60_4_;
      local_45c0 = vmovdqa64_avx512f(auVar71);
      uVar52 = vcmpps_avx512f(local_4700,auVar128,5);
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x30));
      auVar71 = vpbroadcastd_avx512f(ZEXT416(0x20));
      bVar49 = (bool)((byte)uVar52 & 1);
      auVar74._0_4_ = (uint)bVar49 * auVar71._0_4_ | (uint)!bVar49 * auVar69._0_4_;
      bVar49 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar74._4_4_ = (uint)bVar49 * auVar71._4_4_ | (uint)!bVar49 * auVar69._4_4_;
      bVar49 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar74._8_4_ = (uint)bVar49 * auVar71._8_4_ | (uint)!bVar49 * auVar69._8_4_;
      bVar49 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar74._12_4_ = (uint)bVar49 * auVar71._12_4_ | (uint)!bVar49 * auVar69._12_4_;
      bVar49 = (bool)((byte)(uVar52 >> 4) & 1);
      auVar74._16_4_ = (uint)bVar49 * auVar71._16_4_ | (uint)!bVar49 * auVar69._16_4_;
      bVar49 = (bool)((byte)(uVar52 >> 5) & 1);
      auVar74._20_4_ = (uint)bVar49 * auVar71._20_4_ | (uint)!bVar49 * auVar69._20_4_;
      bVar49 = (bool)((byte)(uVar52 >> 6) & 1);
      auVar74._24_4_ = (uint)bVar49 * auVar71._24_4_ | (uint)!bVar49 * auVar69._24_4_;
      bVar49 = (bool)((byte)(uVar52 >> 7) & 1);
      auVar74._28_4_ = (uint)bVar49 * auVar71._28_4_ | (uint)!bVar49 * auVar69._28_4_;
      bVar49 = (bool)((byte)(uVar52 >> 8) & 1);
      auVar74._32_4_ = (uint)bVar49 * auVar71._32_4_ | (uint)!bVar49 * auVar69._32_4_;
      bVar49 = (bool)((byte)(uVar52 >> 9) & 1);
      auVar74._36_4_ = (uint)bVar49 * auVar71._36_4_ | (uint)!bVar49 * auVar69._36_4_;
      bVar49 = (bool)((byte)(uVar52 >> 10) & 1);
      auVar74._40_4_ = (uint)bVar49 * auVar71._40_4_ | (uint)!bVar49 * auVar69._40_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xb) & 1);
      auVar74._44_4_ = (uint)bVar49 * auVar71._44_4_ | (uint)!bVar49 * auVar69._44_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xc) & 1);
      auVar74._48_4_ = (uint)bVar49 * auVar71._48_4_ | (uint)!bVar49 * auVar69._48_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xd) & 1);
      auVar74._52_4_ = (uint)bVar49 * auVar71._52_4_ | (uint)!bVar49 * auVar69._52_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xe) & 1);
      auVar74._56_4_ = (uint)bVar49 * auVar71._56_4_ | (uint)!bVar49 * auVar69._56_4_;
      bVar49 = SUB81(uVar52 >> 0xf,0);
      auVar74._60_4_ = (uint)bVar49 * auVar71._60_4_ | (uint)!bVar49 * auVar69._60_4_;
      local_4580 = vmovdqa64_avx512f(auVar74);
      uVar52 = vcmpps_avx512f(local_46c0,auVar128,5);
      auVar69 = vpbroadcastd_avx512f(ZEXT416(0x50));
      auVar71 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar49 = (bool)((byte)uVar52 & 1);
      auVar75._0_4_ = (uint)bVar49 * auVar71._0_4_ | (uint)!bVar49 * auVar69._0_4_;
      bVar49 = (bool)((byte)(uVar52 >> 1) & 1);
      auVar75._4_4_ = (uint)bVar49 * auVar71._4_4_ | (uint)!bVar49 * auVar69._4_4_;
      bVar49 = (bool)((byte)(uVar52 >> 2) & 1);
      auVar75._8_4_ = (uint)bVar49 * auVar71._8_4_ | (uint)!bVar49 * auVar69._8_4_;
      bVar49 = (bool)((byte)(uVar52 >> 3) & 1);
      auVar75._12_4_ = (uint)bVar49 * auVar71._12_4_ | (uint)!bVar49 * auVar69._12_4_;
      bVar49 = (bool)((byte)(uVar52 >> 4) & 1);
      auVar75._16_4_ = (uint)bVar49 * auVar71._16_4_ | (uint)!bVar49 * auVar69._16_4_;
      bVar49 = (bool)((byte)(uVar52 >> 5) & 1);
      auVar75._20_4_ = (uint)bVar49 * auVar71._20_4_ | (uint)!bVar49 * auVar69._20_4_;
      bVar49 = (bool)((byte)(uVar52 >> 6) & 1);
      auVar75._24_4_ = (uint)bVar49 * auVar71._24_4_ | (uint)!bVar49 * auVar69._24_4_;
      bVar49 = (bool)((byte)(uVar52 >> 7) & 1);
      auVar75._28_4_ = (uint)bVar49 * auVar71._28_4_ | (uint)!bVar49 * auVar69._28_4_;
      bVar49 = (bool)((byte)(uVar52 >> 8) & 1);
      auVar75._32_4_ = (uint)bVar49 * auVar71._32_4_ | (uint)!bVar49 * auVar69._32_4_;
      bVar49 = (bool)((byte)(uVar52 >> 9) & 1);
      auVar75._36_4_ = (uint)bVar49 * auVar71._36_4_ | (uint)!bVar49 * auVar69._36_4_;
      bVar49 = (bool)((byte)(uVar52 >> 10) & 1);
      auVar75._40_4_ = (uint)bVar49 * auVar71._40_4_ | (uint)!bVar49 * auVar69._40_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xb) & 1);
      auVar75._44_4_ = (uint)bVar49 * auVar71._44_4_ | (uint)!bVar49 * auVar69._44_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xc) & 1);
      auVar75._48_4_ = (uint)bVar49 * auVar71._48_4_ | (uint)!bVar49 * auVar69._48_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xd) & 1);
      auVar75._52_4_ = (uint)bVar49 * auVar71._52_4_ | (uint)!bVar49 * auVar69._52_4_;
      bVar49 = (bool)((byte)(uVar52 >> 0xe) & 1);
      auVar75._56_4_ = (uint)bVar49 * auVar71._56_4_ | (uint)!bVar49 * auVar69._56_4_;
      bVar49 = SUB81(uVar52 >> 0xf,0);
      auVar75._60_4_ = (uint)bVar49 * auVar71._60_4_ | (uint)!bVar49 * auVar69._60_4_;
      local_4540 = vmovdqa64_avx512f(auVar75);
      auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      auVar69 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar128);
      bVar49 = (bool)((byte)uVar64 & 1);
      local_4500 = (uint)bVar49 * auVar69._0_4_ | (uint)!bVar49 * auVar71._0_4_;
      bVar49 = (bool)((byte)(uVar64 >> 1) & 1);
      uStack_44fc = (uint)bVar49 * auVar69._4_4_ | (uint)!bVar49 * auVar71._4_4_;
      bVar49 = (bool)((byte)(uVar64 >> 2) & 1);
      uStack_44f8 = (uint)bVar49 * auVar69._8_4_ | (uint)!bVar49 * auVar71._8_4_;
      bVar49 = (bool)((byte)(uVar64 >> 3) & 1);
      uStack_44f4 = (uint)bVar49 * auVar69._12_4_ | (uint)!bVar49 * auVar71._12_4_;
      bVar49 = (bool)((byte)(uVar64 >> 4) & 1);
      uStack_44f0 = (uint)bVar49 * auVar69._16_4_ | (uint)!bVar49 * auVar71._16_4_;
      bVar49 = (bool)((byte)(uVar64 >> 5) & 1);
      uStack_44ec = (uint)bVar49 * auVar69._20_4_ | (uint)!bVar49 * auVar71._20_4_;
      bVar49 = (bool)((byte)(uVar64 >> 6) & 1);
      uStack_44e8 = (uint)bVar49 * auVar69._24_4_ | (uint)!bVar49 * auVar71._24_4_;
      bVar49 = (bool)((byte)(uVar64 >> 7) & 1);
      uStack_44e4 = (uint)bVar49 * auVar69._28_4_ | (uint)!bVar49 * auVar71._28_4_;
      bVar48 = (byte)(uVar64 >> 8);
      bVar49 = (bool)(bVar48 & 1);
      uStack_44e0 = (uint)bVar49 * auVar69._32_4_ | (uint)!bVar49 * auVar71._32_4_;
      bVar49 = (bool)((byte)(uVar64 >> 9) & 1);
      uStack_44dc = (uint)bVar49 * auVar69._36_4_ | (uint)!bVar49 * auVar71._36_4_;
      bVar49 = (bool)((byte)(uVar64 >> 10) & 1);
      uStack_44d8 = (uint)bVar49 * auVar69._40_4_ | (uint)!bVar49 * auVar71._40_4_;
      bVar49 = (bool)((byte)(uVar64 >> 0xb) & 1);
      uStack_44d4 = (uint)bVar49 * auVar69._44_4_ | (uint)!bVar49 * auVar71._44_4_;
      bVar49 = (bool)((byte)(uVar64 >> 0xc) & 1);
      uStack_44d0 = (uint)bVar49 * auVar69._48_4_ | (uint)!bVar49 * auVar71._48_4_;
      bVar49 = (bool)((byte)(uVar64 >> 0xd) & 1);
      uStack_44cc = (uint)bVar49 * auVar69._52_4_ | (uint)!bVar49 * auVar71._52_4_;
      bVar49 = (bool)((byte)(uVar64 >> 0xe) & 1);
      uStack_44c8 = (uint)bVar49 * auVar69._56_4_ | (uint)!bVar49 * auVar71._56_4_;
      bVar49 = SUB81(uVar64 >> 0xf,0);
      uStack_44c4 = (uint)bVar49 * auVar69._60_4_ | (uint)!bVar49 * auVar71._60_4_;
      auVar69 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar128 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar128);
      bVar49 = (bool)((byte)uVar64 & 1);
      bVar5 = (bool)((byte)(uVar64 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar64 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar64 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar64 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar64 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar64 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar64 >> 7) & 1);
      bVar13 = (bool)(bVar48 & 1);
      bVar14 = (bool)((byte)(uVar64 >> 9) & 1);
      bVar15 = (bool)((byte)(uVar64 >> 10) & 1);
      bVar16 = (bool)((byte)(uVar64 >> 0xb) & 1);
      bVar17 = (bool)((byte)(uVar64 >> 0xc) & 1);
      bVar18 = (bool)((byte)(uVar64 >> 0xd) & 1);
      bVar19 = (bool)((byte)(uVar64 >> 0xe) & 1);
      bVar20 = SUB81(uVar64 >> 0xf,0);
      local_44c0 = (uint)bVar49 * auVar128._0_4_ | (uint)!bVar49 * auVar69._0_4_;
      uStack_44bc = (uint)bVar5 * auVar128._4_4_ | (uint)!bVar5 * auVar69._4_4_;
      uStack_44b8 = (uint)bVar6 * auVar128._8_4_ | (uint)!bVar6 * auVar69._8_4_;
      uStack_44b4 = (uint)bVar7 * auVar128._12_4_ | (uint)!bVar7 * auVar69._12_4_;
      uStack_44b0 = (uint)bVar8 * auVar128._16_4_ | (uint)!bVar8 * auVar69._16_4_;
      uStack_44ac = (uint)bVar9 * auVar128._20_4_ | (uint)!bVar9 * auVar69._20_4_;
      uStack_44a8 = (uint)bVar10 * auVar128._24_4_ | (uint)!bVar10 * auVar69._24_4_;
      uStack_44a4 = (uint)bVar11 * auVar128._28_4_ | (uint)!bVar11 * auVar69._28_4_;
      uStack_44a0 = (uint)bVar13 * auVar128._32_4_ | (uint)!bVar13 * auVar69._32_4_;
      uStack_449c = (uint)bVar14 * auVar128._36_4_ | (uint)!bVar14 * auVar69._36_4_;
      uStack_4498 = (uint)bVar15 * auVar128._40_4_ | (uint)!bVar15 * auVar69._40_4_;
      uStack_4494 = (uint)bVar16 * auVar128._44_4_ | (uint)!bVar16 * auVar69._44_4_;
      uStack_4490 = (uint)bVar17 * auVar128._48_4_ | (uint)!bVar17 * auVar69._48_4_;
      uStack_448c = (uint)bVar18 * auVar128._52_4_ | (uint)!bVar18 * auVar69._52_4_;
      uStack_4488 = (uint)bVar19 * auVar128._56_4_ | (uint)!bVar19 * auVar69._56_4_;
      uStack_4484 = (uint)bVar20 * auVar128._60_4_ | (uint)!bVar20 * auVar69._60_4_;
      uVar63 = (uint)(ushort)~(ushort)uVar64;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar56 = 0xe;
      }
      else {
        uVar56 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar56 = 0xe;
        }
      }
      pRVar1 = ray + 0x200;
      puVar60 = local_4440;
      local_4450 = 0xfffffffffffffff8;
      pauVar59 = (undefined1 (*) [64])local_3c40;
      local_3c80 = local_4500;
      uStack_3c7c = uStack_44fc;
      uStack_3c78 = uStack_44f8;
      uStack_3c74 = uStack_44f4;
      uStack_3c70 = uStack_44f0;
      uStack_3c6c = uStack_44ec;
      uStack_3c68 = uStack_44e8;
      uStack_3c64 = uStack_44e4;
      uStack_3c60 = uStack_44e0;
      uStack_3c5c = uStack_44dc;
      uStack_3c58 = uStack_44d8;
      uStack_3c54 = uStack_44d4;
      uStack_3c50 = uStack_44d0;
      uStack_3c4c = uStack_44cc;
      uStack_3c48 = uStack_44c8;
      uStack_3c44 = uStack_44c4;
      local_5348 = (undefined1 (*) [32])local_4e80;
      auVar68 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
      auVar72 = ZEXT1664(auVar68);
      auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
      auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      local_52f8 = This;
      local_3cc0 = auVar71;
LAB_01f6d7c8:
      do {
        do {
          root.ptr = puVar60[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f6ef21;
          puVar60 = puVar60 + -1;
          pauVar59 = pauVar59 + -1;
          local_51c0 = *pauVar59;
          auVar76._4_4_ = uStack_44bc;
          auVar76._0_4_ = local_44c0;
          auVar76._8_4_ = uStack_44b8;
          auVar76._12_4_ = uStack_44b4;
          auVar76._16_4_ = uStack_44b0;
          auVar76._20_4_ = uStack_44ac;
          auVar76._24_4_ = uStack_44a8;
          auVar76._28_4_ = uStack_44a4;
          auVar76._32_4_ = uStack_44a0;
          auVar76._36_4_ = uStack_449c;
          auVar76._40_4_ = uStack_4498;
          auVar76._44_4_ = uStack_4494;
          auVar76._48_4_ = uStack_4490;
          auVar76._52_4_ = uStack_448c;
          auVar76._56_4_ = uStack_4488;
          auVar76._60_4_ = uStack_4484;
          uVar52 = vcmpps_avx512f(local_51c0,auVar76,1);
        } while ((short)uVar52 == 0);
        uVar61 = (undefined4)uVar52;
        if (uVar56 < (uint)POPCOUNT(uVar61)) {
LAB_01f6d811:
          do {
            uVar51 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f6ef21;
              auVar89._4_4_ = uStack_44bc;
              auVar89._0_4_ = local_44c0;
              auVar89._8_4_ = uStack_44b8;
              auVar89._12_4_ = uStack_44b4;
              auVar89._16_4_ = uStack_44b0;
              auVar89._20_4_ = uStack_44ac;
              auVar89._24_4_ = uStack_44a8;
              auVar89._28_4_ = uStack_44a4;
              auVar89._32_4_ = uStack_44a0;
              auVar89._36_4_ = uStack_449c;
              auVar89._40_4_ = uStack_4498;
              auVar89._44_4_ = uStack_4494;
              auVar89._48_4_ = uStack_4490;
              auVar89._52_4_ = uStack_448c;
              auVar89._56_4_ = uStack_4488;
              auVar89._60_4_ = uStack_4484;
              uVar23 = vcmpps_avx512f(local_51c0,auVar89,9);
              if ((short)uVar23 != 0) {
                if ((uVar51 & 0xf) == 8) {
                  local_53a4 = uVar63 ^ 0xffff;
                  auVar68 = vcvtusi2ss_avx512f(in_ZMM16._0_16_,
                                               *(int *)(local_5358.super_Precalculations.grid + 8) +
                                               -1);
                  auVar73 = vbroadcastss_avx512f(auVar68);
                  auVar74 = vmulps_avx512f(auVar73,*(undefined1 (*) [64])(ray + 0x1c0));
                  auVar73 = vrndscaleps_avx512f(auVar74,1);
                  auVar75 = vbroadcastss_avx512f(ZEXT416((uint)(auVar68._0_4_ + -1.0)));
                  auVar73 = vminps_avx512f(auVar73,auVar75);
                  auVar75 = vmaxps_avx512f(auVar73,auVar72);
                  local_5080 = vcvtps2dq_avx512f(auVar75);
                  auVar73 = local_5080;
                  if ((short)uVar63 == -1) {
                    local_53a4 = (uint)CONCAT62((uint6)(ushort)((uint)(*(int *)(local_5358.
                                                                                                                                                                
                                                  super_Precalculations.grid + 8) + -1) >> 0x10),
                                                0xffff);
                  }
                  else {
                    local_4a00 = vsubps_avx512f(auVar74,auVar75);
                    auVar74 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    local_4a40 = vsubps_avx512f(auVar74,local_4a00);
                    local_4e00 = local_5080._0_8_;
                    uStack_4df8 = local_5080._8_8_;
                    uStack_4df0 = local_5080._16_8_;
                    uStack_4de8 = local_5080._24_8_;
                    uStack_4de0 = local_5080._32_8_;
                    uStack_4dd8 = local_5080._40_8_;
                    uStack_4dd0 = local_5080._48_8_;
                    uStack_4dc8 = local_5080._56_8_;
                    uVar52 = root.ptr >> 2 & 0xfffffffffffffffc;
                    local_539c = local_53a4;
                    local_5080 = auVar73;
                    do {
                      uVar51 = 0;
                      for (uVar50 = local_539c; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x80000000
                          ) {
                        uVar51 = uVar51 + 1;
                      }
                      auVar73 = vpbroadcastd_avx512f();
                      auVar90._8_8_ = uStack_4df8;
                      auVar90._0_8_ = local_4e00;
                      auVar90._16_8_ = uStack_4df0;
                      auVar90._24_8_ = uStack_4de8;
                      auVar90._32_8_ = uStack_4de0;
                      auVar90._40_8_ = uStack_4dd8;
                      auVar90._48_8_ = uStack_4dd0;
                      auVar90._56_8_ = uStack_4dc8;
                      uVar23 = vpcmpeqd_avx512f(auVar73,auVar90);
                      uVar50 = (uint)uVar23 & local_539c;
                      uVar57 = (ulong)*(uint *)(local_5358.super_Precalculations.grid + 0x14);
                      uVar66 = CONCAT71(0,(ulong)*(uint *)(local_5358.super_Precalculations.grid +
                                                          0xc) != 2);
                      local_5240._0_8_ = uVar66;
                      lVar62 = (ulong)*(uint *)(local_5358.super_Precalculations.grid + 0x28) *
                               (long)*(int *)(local_5080 + (ulong)uVar51 * 4) +
                               (ulong)*(uint *)(local_5358.super_Precalculations.grid + 0x24);
                      uVar65 = (ulong)(*(uint *)(local_5358.super_Precalculations.grid + 0x28) &
                                      0xfffffffc);
                      lVar54 = lVar62 + uVar65;
                      local_52c8 = local_5358.super_Precalculations.grid +
                                   lVar54 + uVar57 * 0xc + uVar52;
                      lVar55 = lVar62 + uVar57 * 8;
                      local_52a0 = local_5358.super_Precalculations.grid + uVar65 + lVar55 + uVar52;
                      local_52d8 = local_5358.super_Precalculations.grid +
                                   lVar54 + uVar57 * 4 + uVar52;
                      local_52c0 = local_5358.super_Precalculations.grid + lVar54 + uVar52;
                      lVar54 = lVar62 + uVar57 * 4;
                      local_52f0 = local_5358.super_Precalculations.grid + lVar55 + uVar52 + 0x30;
                      local_52e0 = local_5358.super_Precalculations.grid + lVar54 + uVar52 + 0x30;
                      local_52b8 = local_5358.super_Precalculations.grid + lVar62 + uVar52;
                      lVar58 = uVar52 + 0x2c;
                      local_52d0 = local_5358.super_Precalculations.grid + lVar55 + lVar58;
                      local_52e8 = local_5358.super_Precalculations.grid + lVar54 + lVar58;
                      local_52b0 = local_5358.super_Precalculations.grid + lVar62 + lVar58;
                      uVar51 = ~uVar50;
                      iVar67 = *(int *)(local_5358.super_Precalculations.grid + 0x10);
                      local_5298 = uVar66 * 4 + 4;
                      local_52a8 = (ulong)*(uint *)(local_5358.super_Precalculations.grid + 0xc) <<
                                   2;
                      bVar48 = 1;
                      lVar54 = 0;
                      do {
                        pGVar47 = local_52b0;
                        pGVar46 = local_52b8;
                        lVar58 = (lVar54 + 1) * local_52a8;
                        local_5338 = local_52c8 + lVar58;
                        local_5248 = local_52a0 + lVar58;
                        local_5250 = local_52d8 + lVar58;
                        local_5258 = local_52c0 + lVar58;
                        local_5260 = local_52f0 + lVar58;
                        local_5268 = local_52e0 + lVar58;
                        lVar54 = lVar54 * local_52a8;
                        local_5340 = local_52c8 + lVar54;
                        local_5270 = local_52a0 + lVar54;
                        local_5278 = local_52d8 + lVar54;
                        local_5280 = local_52c0 + lVar54;
                        local_5288 = local_52d0 + lVar54;
                        local_5290 = local_52e8 + lVar54;
                        lVar55 = 0;
                        do {
                          auVar68 = auVar72._0_16_;
                          if (local_5298 == lVar55) goto LAB_01f6ed50;
                          uVar61 = *(undefined4 *)(local_5280 + lVar55 + 0x2c);
                          auVar91._4_4_ = uVar61;
                          auVar91._0_4_ = uVar61;
                          auVar91._8_4_ = uVar61;
                          auVar91._12_4_ = uVar61;
                          auVar91._16_4_ = uVar61;
                          auVar91._20_4_ = uVar61;
                          auVar91._24_4_ = uVar61;
                          auVar91._28_4_ = uVar61;
                          auVar91._32_4_ = uVar61;
                          auVar91._36_4_ = uVar61;
                          auVar91._40_4_ = uVar61;
                          auVar91._44_4_ = uVar61;
                          auVar91._48_4_ = uVar61;
                          auVar91._52_4_ = uVar61;
                          auVar91._56_4_ = uVar61;
                          auVar91._60_4_ = uVar61;
                          auVar73 = vmulps_avx512f(local_4a00,auVar91);
                          uVar61 = *(undefined4 *)(local_5278 + lVar55 + 0x2c);
                          auVar92._4_4_ = uVar61;
                          auVar92._0_4_ = uVar61;
                          auVar92._8_4_ = uVar61;
                          auVar92._12_4_ = uVar61;
                          auVar92._16_4_ = uVar61;
                          auVar92._20_4_ = uVar61;
                          auVar92._24_4_ = uVar61;
                          auVar92._28_4_ = uVar61;
                          auVar92._32_4_ = uVar61;
                          auVar92._36_4_ = uVar61;
                          auVar92._40_4_ = uVar61;
                          auVar92._44_4_ = uVar61;
                          auVar92._48_4_ = uVar61;
                          auVar92._52_4_ = uVar61;
                          auVar92._56_4_ = uVar61;
                          auVar92._60_4_ = uVar61;
                          auVar74 = vmulps_avx512f(local_4a00,auVar92);
                          uVar61 = *(undefined4 *)(local_5270 + lVar55 + 0x2c);
                          auVar93._4_4_ = uVar61;
                          auVar93._0_4_ = uVar61;
                          auVar93._8_4_ = uVar61;
                          auVar93._12_4_ = uVar61;
                          auVar93._16_4_ = uVar61;
                          auVar93._20_4_ = uVar61;
                          auVar93._24_4_ = uVar61;
                          auVar93._28_4_ = uVar61;
                          auVar93._32_4_ = uVar61;
                          auVar93._36_4_ = uVar61;
                          auVar93._40_4_ = uVar61;
                          auVar93._44_4_ = uVar61;
                          auVar93._48_4_ = uVar61;
                          auVar93._52_4_ = uVar61;
                          auVar93._56_4_ = uVar61;
                          auVar93._60_4_ = uVar61;
                          auVar75 = vmulps_avx512f(local_4a00,auVar93);
                          uVar61 = *(undefined4 *)(pGVar47 + lVar55 + lVar54);
                          auVar94._4_4_ = uVar61;
                          auVar94._0_4_ = uVar61;
                          auVar94._8_4_ = uVar61;
                          auVar94._12_4_ = uVar61;
                          auVar94._16_4_ = uVar61;
                          auVar94._20_4_ = uVar61;
                          auVar94._24_4_ = uVar61;
                          auVar94._28_4_ = uVar61;
                          auVar94._32_4_ = uVar61;
                          auVar94._36_4_ = uVar61;
                          auVar94._40_4_ = uVar61;
                          auVar94._44_4_ = uVar61;
                          auVar94._48_4_ = uVar61;
                          auVar94._52_4_ = uVar61;
                          auVar94._56_4_ = uVar61;
                          auVar94._60_4_ = uVar61;
                          auVar79 = vfmadd231ps_avx512f(auVar73,local_4a40,auVar94);
                          uVar61 = *(undefined4 *)(local_5290 + lVar55);
                          auVar95._4_4_ = uVar61;
                          auVar95._0_4_ = uVar61;
                          auVar95._8_4_ = uVar61;
                          auVar95._12_4_ = uVar61;
                          auVar95._16_4_ = uVar61;
                          auVar95._20_4_ = uVar61;
                          auVar95._24_4_ = uVar61;
                          auVar95._28_4_ = uVar61;
                          auVar95._32_4_ = uVar61;
                          auVar95._36_4_ = uVar61;
                          auVar95._40_4_ = uVar61;
                          auVar95._44_4_ = uVar61;
                          auVar95._48_4_ = uVar61;
                          auVar95._52_4_ = uVar61;
                          auVar95._56_4_ = uVar61;
                          auVar95._60_4_ = uVar61;
                          auVar80 = vfmadd231ps_avx512f(auVar74,local_4a40,auVar95);
                          uVar61 = *(undefined4 *)(local_5288 + lVar55);
                          auVar96._4_4_ = uVar61;
                          auVar96._0_4_ = uVar61;
                          auVar96._8_4_ = uVar61;
                          auVar96._12_4_ = uVar61;
                          auVar96._16_4_ = uVar61;
                          auVar96._20_4_ = uVar61;
                          auVar96._24_4_ = uVar61;
                          auVar96._28_4_ = uVar61;
                          auVar96._32_4_ = uVar61;
                          auVar96._36_4_ = uVar61;
                          auVar96._40_4_ = uVar61;
                          auVar96._44_4_ = uVar61;
                          auVar96._48_4_ = uVar61;
                          auVar96._52_4_ = uVar61;
                          auVar96._56_4_ = uVar61;
                          auVar96._60_4_ = uVar61;
                          auVar81 = vfmadd231ps_avx512f(auVar75,local_4a40,auVar96);
                          uVar61 = *(undefined4 *)(local_5280 + lVar55 + 0x30);
                          auVar97._4_4_ = uVar61;
                          auVar97._0_4_ = uVar61;
                          auVar97._8_4_ = uVar61;
                          auVar97._12_4_ = uVar61;
                          auVar97._16_4_ = uVar61;
                          auVar97._20_4_ = uVar61;
                          auVar97._24_4_ = uVar61;
                          auVar97._28_4_ = uVar61;
                          auVar97._32_4_ = uVar61;
                          auVar97._36_4_ = uVar61;
                          auVar97._40_4_ = uVar61;
                          auVar97._44_4_ = uVar61;
                          auVar97._48_4_ = uVar61;
                          auVar97._52_4_ = uVar61;
                          auVar97._56_4_ = uVar61;
                          auVar97._60_4_ = uVar61;
                          auVar73 = vmulps_avx512f(local_4a00,auVar97);
                          uVar61 = *(undefined4 *)(local_5278 + lVar55 + 0x30);
                          auVar26._4_4_ = uVar61;
                          auVar26._0_4_ = uVar61;
                          auVar26._8_4_ = uVar61;
                          auVar26._12_4_ = uVar61;
                          auVar26._16_4_ = uVar61;
                          auVar26._20_4_ = uVar61;
                          auVar26._24_4_ = uVar61;
                          auVar26._28_4_ = uVar61;
                          auVar26._32_4_ = uVar61;
                          auVar26._36_4_ = uVar61;
                          auVar26._40_4_ = uVar61;
                          auVar26._44_4_ = uVar61;
                          auVar26._48_4_ = uVar61;
                          auVar26._52_4_ = uVar61;
                          auVar26._56_4_ = uVar61;
                          auVar26._60_4_ = uVar61;
                          auVar74 = vmulps_avx512f(local_4a00,auVar26);
                          uVar61 = *(undefined4 *)(local_5270 + lVar55 + 0x30);
                          auVar27._4_4_ = uVar61;
                          auVar27._0_4_ = uVar61;
                          auVar27._8_4_ = uVar61;
                          auVar27._12_4_ = uVar61;
                          auVar27._16_4_ = uVar61;
                          auVar27._20_4_ = uVar61;
                          auVar27._24_4_ = uVar61;
                          auVar27._28_4_ = uVar61;
                          auVar27._32_4_ = uVar61;
                          auVar27._36_4_ = uVar61;
                          auVar27._40_4_ = uVar61;
                          auVar27._44_4_ = uVar61;
                          auVar27._48_4_ = uVar61;
                          auVar27._52_4_ = uVar61;
                          auVar27._56_4_ = uVar61;
                          auVar27._60_4_ = uVar61;
                          auVar75 = vmulps_avx512f(local_4a00,auVar27);
                          uVar61 = *(undefined4 *)(pGVar47 + lVar55 + lVar54 + 4);
                          auVar28._4_4_ = uVar61;
                          auVar28._0_4_ = uVar61;
                          auVar28._8_4_ = uVar61;
                          auVar28._12_4_ = uVar61;
                          auVar28._16_4_ = uVar61;
                          auVar28._20_4_ = uVar61;
                          auVar28._24_4_ = uVar61;
                          auVar28._28_4_ = uVar61;
                          auVar28._32_4_ = uVar61;
                          auVar28._36_4_ = uVar61;
                          auVar28._40_4_ = uVar61;
                          auVar28._44_4_ = uVar61;
                          auVar28._48_4_ = uVar61;
                          auVar28._52_4_ = uVar61;
                          auVar28._56_4_ = uVar61;
                          auVar28._60_4_ = uVar61;
                          auVar78 = vfmadd231ps_avx512f(auVar73,local_4a40,auVar28);
                          uVar61 = *(undefined4 *)(local_5290 + lVar55 + 4);
                          auVar29._4_4_ = uVar61;
                          auVar29._0_4_ = uVar61;
                          auVar29._8_4_ = uVar61;
                          auVar29._12_4_ = uVar61;
                          auVar29._16_4_ = uVar61;
                          auVar29._20_4_ = uVar61;
                          auVar29._24_4_ = uVar61;
                          auVar29._28_4_ = uVar61;
                          auVar29._32_4_ = uVar61;
                          auVar29._36_4_ = uVar61;
                          auVar29._40_4_ = uVar61;
                          auVar29._44_4_ = uVar61;
                          auVar29._48_4_ = uVar61;
                          auVar29._52_4_ = uVar61;
                          auVar29._56_4_ = uVar61;
                          auVar29._60_4_ = uVar61;
                          local_5240 = vfmadd231ps_avx512f(auVar74,local_4a40,auVar29);
                          uVar61 = *(undefined4 *)(local_5288 + lVar55 + 4);
                          auVar30._4_4_ = uVar61;
                          auVar30._0_4_ = uVar61;
                          auVar30._8_4_ = uVar61;
                          auVar30._12_4_ = uVar61;
                          auVar30._16_4_ = uVar61;
                          auVar30._20_4_ = uVar61;
                          auVar30._24_4_ = uVar61;
                          auVar30._28_4_ = uVar61;
                          auVar30._32_4_ = uVar61;
                          auVar30._36_4_ = uVar61;
                          auVar30._40_4_ = uVar61;
                          auVar30._44_4_ = uVar61;
                          auVar30._48_4_ = uVar61;
                          auVar30._52_4_ = uVar61;
                          auVar30._56_4_ = uVar61;
                          auVar30._60_4_ = uVar61;
                          local_51c0 = vfmadd231ps_avx512f(auVar75,local_4a40,auVar30);
                          uVar61 = *(undefined4 *)(local_5258 + lVar55 + 0x2c);
                          auVar31._4_4_ = uVar61;
                          auVar31._0_4_ = uVar61;
                          auVar31._8_4_ = uVar61;
                          auVar31._12_4_ = uVar61;
                          auVar31._16_4_ = uVar61;
                          auVar31._20_4_ = uVar61;
                          auVar31._24_4_ = uVar61;
                          auVar31._28_4_ = uVar61;
                          auVar31._32_4_ = uVar61;
                          auVar31._36_4_ = uVar61;
                          auVar31._40_4_ = uVar61;
                          auVar31._44_4_ = uVar61;
                          auVar31._48_4_ = uVar61;
                          auVar31._52_4_ = uVar61;
                          auVar31._56_4_ = uVar61;
                          auVar31._60_4_ = uVar61;
                          auVar73 = vmulps_avx512f(local_4a00,auVar31);
                          uVar61 = *(undefined4 *)(local_5250 + lVar55 + 0x2c);
                          auVar32._4_4_ = uVar61;
                          auVar32._0_4_ = uVar61;
                          auVar32._8_4_ = uVar61;
                          auVar32._12_4_ = uVar61;
                          auVar32._16_4_ = uVar61;
                          auVar32._20_4_ = uVar61;
                          auVar32._24_4_ = uVar61;
                          auVar32._28_4_ = uVar61;
                          auVar32._32_4_ = uVar61;
                          auVar32._36_4_ = uVar61;
                          auVar32._40_4_ = uVar61;
                          auVar32._44_4_ = uVar61;
                          auVar32._48_4_ = uVar61;
                          auVar32._52_4_ = uVar61;
                          auVar32._56_4_ = uVar61;
                          auVar32._60_4_ = uVar61;
                          auVar74 = vmulps_avx512f(local_4a00,auVar32);
                          uVar61 = *(undefined4 *)(local_5248 + lVar55 + 0x2c);
                          auVar33._4_4_ = uVar61;
                          auVar33._0_4_ = uVar61;
                          auVar33._8_4_ = uVar61;
                          auVar33._12_4_ = uVar61;
                          auVar33._16_4_ = uVar61;
                          auVar33._20_4_ = uVar61;
                          auVar33._24_4_ = uVar61;
                          auVar33._28_4_ = uVar61;
                          auVar33._32_4_ = uVar61;
                          auVar33._36_4_ = uVar61;
                          auVar33._40_4_ = uVar61;
                          auVar33._44_4_ = uVar61;
                          auVar33._48_4_ = uVar61;
                          auVar33._52_4_ = uVar61;
                          auVar33._56_4_ = uVar61;
                          auVar33._60_4_ = uVar61;
                          auVar75 = vmulps_avx512f(local_4a00,auVar33);
                          uVar61 = *(undefined4 *)(pGVar46 + lVar55 + lVar58 + 0x2c);
                          auVar34._4_4_ = uVar61;
                          auVar34._0_4_ = uVar61;
                          auVar34._8_4_ = uVar61;
                          auVar34._12_4_ = uVar61;
                          auVar34._16_4_ = uVar61;
                          auVar34._20_4_ = uVar61;
                          auVar34._24_4_ = uVar61;
                          auVar34._28_4_ = uVar61;
                          auVar34._32_4_ = uVar61;
                          auVar34._36_4_ = uVar61;
                          auVar34._40_4_ = uVar61;
                          auVar34._44_4_ = uVar61;
                          auVar34._48_4_ = uVar61;
                          auVar34._52_4_ = uVar61;
                          auVar34._56_4_ = uVar61;
                          auVar34._60_4_ = uVar61;
                          local_4900 = vfmadd231ps_avx512f(auVar73,local_4a40,auVar34);
                          uVar61 = *(undefined4 *)(local_5268 + lVar55 + -4);
                          auVar35._4_4_ = uVar61;
                          auVar35._0_4_ = uVar61;
                          auVar35._8_4_ = uVar61;
                          auVar35._12_4_ = uVar61;
                          auVar35._16_4_ = uVar61;
                          auVar35._20_4_ = uVar61;
                          auVar35._24_4_ = uVar61;
                          auVar35._28_4_ = uVar61;
                          auVar35._32_4_ = uVar61;
                          auVar35._36_4_ = uVar61;
                          auVar35._40_4_ = uVar61;
                          auVar35._44_4_ = uVar61;
                          auVar35._48_4_ = uVar61;
                          auVar35._52_4_ = uVar61;
                          auVar35._56_4_ = uVar61;
                          auVar35._60_4_ = uVar61;
                          local_4940 = vfmadd231ps_avx512f(auVar74,local_4a40,auVar35);
                          uVar61 = *(undefined4 *)(local_5260 + lVar55 + -4);
                          auVar36._4_4_ = uVar61;
                          auVar36._0_4_ = uVar61;
                          auVar36._8_4_ = uVar61;
                          auVar36._12_4_ = uVar61;
                          auVar36._16_4_ = uVar61;
                          auVar36._20_4_ = uVar61;
                          auVar36._24_4_ = uVar61;
                          auVar36._28_4_ = uVar61;
                          auVar36._32_4_ = uVar61;
                          auVar36._36_4_ = uVar61;
                          auVar36._40_4_ = uVar61;
                          auVar36._44_4_ = uVar61;
                          auVar36._48_4_ = uVar61;
                          auVar36._52_4_ = uVar61;
                          auVar36._56_4_ = uVar61;
                          auVar36._60_4_ = uVar61;
                          local_4980 = vfmadd231ps_avx512f(auVar75,local_4a40,auVar36);
                          auVar73 = *(undefined1 (*) [64])ray;
                          auVar74 = *(undefined1 (*) [64])(ray + 0x40);
                          auVar75 = *(undefined1 (*) [64])(ray + 0x80);
                          auVar76 = *(undefined1 (*) [64])(ray + 0x100);
                          auVar101 = *(undefined1 (*) [64])(ray + 0x140);
                          auVar77 = *(undefined1 (*) [64])(ray + 0x180);
                          auVar79 = vsubps_avx512f(auVar79,auVar73);
                          auVar80 = vsubps_avx512f(auVar80,auVar74);
                          auVar81 = vsubps_avx512f(auVar81,auVar75);
                          auVar82 = vsubps_avx512f(auVar78,auVar73);
                          auVar83 = vsubps_avx512f(local_5240,auVar74);
                          auVar84 = vsubps_avx512f(local_51c0,auVar75);
                          auVar73 = vsubps_avx512f(local_4900,auVar73);
                          auVar74 = vsubps_avx512f(local_4940,auVar74);
                          auVar75 = vsubps_avx512f(local_4980,auVar75);
                          auVar85 = vsubps_avx512f(auVar73,auVar79);
                          auVar86 = vsubps_avx512f(auVar74,auVar80);
                          auVar87 = vsubps_avx512f(auVar75,auVar81);
                          auVar88 = vsubps_avx512f(auVar79,auVar82);
                          in_ZMM16 = vsubps_avx512f(auVar80,auVar83);
                          auVar89 = vsubps_avx512f(auVar81,auVar84);
                          auVar90 = vaddps_avx512f(auVar73,auVar79);
                          auVar91 = vaddps_avx512f(auVar74,auVar80);
                          auVar92 = vaddps_avx512f(auVar75,auVar81);
                          auVar93 = vmulps_avx512f(auVar91,auVar87);
                          auVar93 = vfmsub231ps_avx512f(auVar93,auVar86,auVar92);
                          auVar92 = vmulps_avx512f(auVar92,auVar85);
                          auVar92 = vfmsub231ps_avx512f(auVar92,auVar87,auVar90);
                          auVar90 = vmulps_avx512f(auVar90,auVar86);
                          auVar90 = vfmsub231ps_avx512f(auVar90,auVar85,auVar91);
                          auVar90 = vmulps_avx512f(auVar90,auVar77);
                          auVar90 = vfmadd231ps_avx512f(auVar90,auVar101,auVar92);
                          auVar90 = vfmadd231ps_avx512f(auVar90,auVar76,auVar93);
                          auVar91 = vaddps_avx512f(auVar79,auVar82);
                          auVar92 = vaddps_avx512f(auVar80,auVar83);
                          auVar93 = vaddps_avx512f(auVar81,auVar84);
                          auVar94 = vmulps_avx512f(auVar92,auVar89);
                          auVar94 = vfmsub231ps_avx512f(auVar94,in_ZMM16,auVar93);
                          auVar93 = vmulps_avx512f(auVar93,auVar88);
                          auVar93 = vfmsub231ps_avx512f(auVar93,auVar89,auVar91);
                          auVar91 = vmulps_avx512f(auVar91,in_ZMM16);
                          auVar91 = vfmsub231ps_avx512f(auVar91,auVar88,auVar92);
                          uVar61 = *(undefined4 *)(local_5258 + lVar55 + 0x30);
                          auVar37._4_4_ = uVar61;
                          auVar37._0_4_ = uVar61;
                          auVar37._8_4_ = uVar61;
                          auVar37._12_4_ = uVar61;
                          auVar37._16_4_ = uVar61;
                          auVar37._20_4_ = uVar61;
                          auVar37._24_4_ = uVar61;
                          auVar37._28_4_ = uVar61;
                          auVar37._32_4_ = uVar61;
                          auVar37._36_4_ = uVar61;
                          auVar37._40_4_ = uVar61;
                          auVar37._44_4_ = uVar61;
                          auVar37._48_4_ = uVar61;
                          auVar37._52_4_ = uVar61;
                          auVar37._56_4_ = uVar61;
                          auVar37._60_4_ = uVar61;
                          auVar92 = vmulps_avx512f(local_4a00,auVar37);
                          auVar91 = vmulps_avx512f(auVar91,auVar77);
                          auVar91 = vfmadd231ps_avx512f(auVar91,auVar101,auVar93);
                          auVar93 = vsubps_avx512f(auVar82,auVar73);
                          auVar91 = vfmadd231ps_avx512f(auVar91,auVar76,auVar94);
                          auVar94 = vsubps_avx512f(auVar83,auVar74);
                          auVar73 = vaddps_avx512f(auVar82,auVar73);
                          auVar82 = vsubps_avx512f(auVar84,auVar75);
                          auVar74 = vaddps_avx512f(auVar83,auVar74);
                          auVar75 = vaddps_avx512f(auVar84,auVar75);
                          auVar83 = vmulps_avx512f(auVar74,auVar82);
                          auVar83 = vfmsub231ps_avx512f(auVar83,auVar94,auVar75);
                          auVar75 = vmulps_avx512f(auVar75,auVar93);
                          auVar75 = vfmsub231ps_avx512f(auVar75,auVar82,auVar73);
                          auVar73 = vmulps_avx512f(auVar73,auVar94);
                          auVar73 = vfmsub231ps_avx512f(auVar73,auVar93,auVar74);
                          auVar73 = vmulps_avx512f(auVar73,auVar77);
                          auVar73 = vfmadd231ps_avx512f(auVar73,auVar101,auVar75);
                          auVar73 = vfmadd231ps_avx512f(auVar73,auVar76,auVar83);
                          auVar74 = vaddps_avx512f(auVar90,auVar91);
                          auVar75 = vaddps_avx512f(auVar73,auVar74);
                          auVar74 = vandps_avx512dq(auVar75,auVar70);
                          auVar83 = vmulps_avx512f(auVar74,auVar128);
                          auVar74 = vminps_avx512f(auVar90,auVar91);
                          auVar74 = vminps_avx512f(auVar74,auVar73);
                          auVar84 = vxorps_avx512dq(auVar83,auVar69);
                          uVar23 = vcmpps_avx512f(auVar74,auVar84,5);
                          uVar61 = *(undefined4 *)(local_5250 + lVar55 + 0x30);
                          auVar38._4_4_ = uVar61;
                          auVar38._0_4_ = uVar61;
                          auVar38._8_4_ = uVar61;
                          auVar38._12_4_ = uVar61;
                          auVar38._16_4_ = uVar61;
                          auVar38._20_4_ = uVar61;
                          auVar38._24_4_ = uVar61;
                          auVar38._28_4_ = uVar61;
                          auVar38._32_4_ = uVar61;
                          auVar38._36_4_ = uVar61;
                          auVar38._40_4_ = uVar61;
                          auVar38._44_4_ = uVar61;
                          auVar38._48_4_ = uVar61;
                          auVar38._52_4_ = uVar61;
                          auVar38._56_4_ = uVar61;
                          auVar38._60_4_ = uVar61;
                          auVar74 = vmulps_avx512f(local_4a00,auVar38);
                          auVar84 = vmaxps_avx512f(auVar90,auVar91);
                          auVar73 = vmaxps_avx512f(auVar84,auVar73);
                          uVar61 = *(undefined4 *)(local_5248 + lVar55 + 0x30);
                          auVar39._4_4_ = uVar61;
                          auVar39._0_4_ = uVar61;
                          auVar39._8_4_ = uVar61;
                          auVar39._12_4_ = uVar61;
                          auVar39._16_4_ = uVar61;
                          auVar39._20_4_ = uVar61;
                          auVar39._24_4_ = uVar61;
                          auVar39._28_4_ = uVar61;
                          auVar39._32_4_ = uVar61;
                          auVar39._36_4_ = uVar61;
                          auVar39._40_4_ = uVar61;
                          auVar39._44_4_ = uVar61;
                          auVar39._48_4_ = uVar61;
                          auVar39._52_4_ = uVar61;
                          auVar39._56_4_ = uVar61;
                          auVar39._60_4_ = uVar61;
                          auVar84 = vmulps_avx512f(local_4a00,auVar39);
                          uVar61 = *(undefined4 *)(pGVar46 + lVar55 + lVar58 + 0x30);
                          auVar40._4_4_ = uVar61;
                          auVar40._0_4_ = uVar61;
                          auVar40._8_4_ = uVar61;
                          auVar40._12_4_ = uVar61;
                          auVar40._16_4_ = uVar61;
                          auVar40._20_4_ = uVar61;
                          auVar40._24_4_ = uVar61;
                          auVar40._28_4_ = uVar61;
                          auVar40._32_4_ = uVar61;
                          auVar40._36_4_ = uVar61;
                          auVar40._40_4_ = uVar61;
                          auVar40._44_4_ = uVar61;
                          auVar40._48_4_ = uVar61;
                          auVar40._52_4_ = uVar61;
                          auVar40._56_4_ = uVar61;
                          auVar40._60_4_ = uVar61;
                          local_49c0 = vfmadd231ps_avx512f(auVar92,local_4a40,auVar40);
                          uVar61 = *(undefined4 *)(local_5268 + lVar55);
                          auVar41._4_4_ = uVar61;
                          auVar41._0_4_ = uVar61;
                          auVar41._8_4_ = uVar61;
                          auVar41._12_4_ = uVar61;
                          auVar41._16_4_ = uVar61;
                          auVar41._20_4_ = uVar61;
                          auVar41._24_4_ = uVar61;
                          auVar41._28_4_ = uVar61;
                          auVar41._32_4_ = uVar61;
                          auVar41._36_4_ = uVar61;
                          auVar41._40_4_ = uVar61;
                          auVar41._44_4_ = uVar61;
                          auVar41._48_4_ = uVar61;
                          auVar41._52_4_ = uVar61;
                          auVar41._56_4_ = uVar61;
                          auVar41._60_4_ = uVar61;
                          auVar74 = vfmadd231ps_avx512f(auVar74,local_4a40,auVar41);
                          uVar24 = vcmpps_avx512f(auVar73,auVar83,2);
                          uVar61 = *(undefined4 *)(local_5260 + lVar55);
                          auVar42._4_4_ = uVar61;
                          auVar42._0_4_ = uVar61;
                          auVar42._8_4_ = uVar61;
                          auVar42._12_4_ = uVar61;
                          auVar42._16_4_ = uVar61;
                          auVar42._20_4_ = uVar61;
                          auVar42._24_4_ = uVar61;
                          auVar42._28_4_ = uVar61;
                          auVar42._32_4_ = uVar61;
                          auVar42._36_4_ = uVar61;
                          auVar42._40_4_ = uVar61;
                          auVar42._44_4_ = uVar61;
                          auVar42._48_4_ = uVar61;
                          auVar42._52_4_ = uVar61;
                          auVar42._56_4_ = uVar61;
                          auVar42._60_4_ = uVar61;
                          auVar73 = vfmadd231ps_avx512f(auVar84,local_4a40,auVar42);
                          uVar53 = ((ushort)uVar23 | (ushort)uVar24) & (ushort)uVar50;
                          if (uVar53 == 0) {
LAB_01f6e5b0:
                            uVar53 = 0;
                          }
                          else {
                            auVar83 = vmulps_avx512f(in_ZMM16,auVar87);
                            auVar84 = vmulps_avx512f(auVar85,auVar89);
                            auVar92 = vmulps_avx512f(auVar88,auVar86);
                            auVar95 = vmulps_avx512f(auVar94,auVar89);
                            auVar96 = vmulps_avx512f(auVar88,auVar82);
                            auVar97 = vmulps_avx512f(auVar93,in_ZMM16);
                            auVar86 = vfmsub213ps_avx512f(auVar86,auVar89,auVar83);
                            auVar87 = vfmsub213ps_avx512f(auVar87,auVar88,auVar84);
                            auVar85 = vfmsub213ps_avx512f(auVar85,in_ZMM16,auVar92);
                            auVar82 = vfmsub213ps_avx512f(auVar82,in_ZMM16,auVar95);
                            auVar89 = vfmsub213ps_avx512f(auVar93,auVar89,auVar96);
                            auVar88 = vfmsub213ps_avx512f(auVar94,auVar88,auVar97);
                            auVar83 = vandps_avx512dq(auVar83,auVar70);
                            auVar93 = vandps_avx512dq(auVar95,auVar70);
                            uVar66 = vcmpps_avx512f(auVar83,auVar93,1);
                            auVar83 = vandps_avx512dq(auVar84,auVar70);
                            auVar84 = vandps_avx512dq(auVar96,auVar70);
                            uVar65 = vcmpps_avx512f(auVar83,auVar84,1);
                            auVar83 = vandps_avx512dq(auVar92,auVar70);
                            auVar84 = vandps_avx512dq(auVar97,auVar70);
                            uVar57 = vcmpps_avx512f(auVar83,auVar84,1);
                            bVar49 = (bool)((byte)uVar66 & 1);
                            auVar98._0_4_ =
                                 (uint)bVar49 * auVar86._0_4_ | (uint)!bVar49 * auVar82._0_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 1) & 1);
                            auVar98._4_4_ =
                                 (uint)bVar49 * auVar86._4_4_ | (uint)!bVar49 * auVar82._4_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 2) & 1);
                            auVar98._8_4_ =
                                 (uint)bVar49 * auVar86._8_4_ | (uint)!bVar49 * auVar82._8_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 3) & 1);
                            auVar98._12_4_ =
                                 (uint)bVar49 * auVar86._12_4_ | (uint)!bVar49 * auVar82._12_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 4) & 1);
                            auVar98._16_4_ =
                                 (uint)bVar49 * auVar86._16_4_ | (uint)!bVar49 * auVar82._16_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 5) & 1);
                            auVar98._20_4_ =
                                 (uint)bVar49 * auVar86._20_4_ | (uint)!bVar49 * auVar82._20_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 6) & 1);
                            auVar98._24_4_ =
                                 (uint)bVar49 * auVar86._24_4_ | (uint)!bVar49 * auVar82._24_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 7) & 1);
                            auVar98._28_4_ =
                                 (uint)bVar49 * auVar86._28_4_ | (uint)!bVar49 * auVar82._28_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 8) & 1);
                            auVar98._32_4_ =
                                 (uint)bVar49 * auVar86._32_4_ | (uint)!bVar49 * auVar82._32_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 9) & 1);
                            auVar98._36_4_ =
                                 (uint)bVar49 * auVar86._36_4_ | (uint)!bVar49 * auVar82._36_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 10) & 1);
                            auVar98._40_4_ =
                                 (uint)bVar49 * auVar86._40_4_ | (uint)!bVar49 * auVar82._40_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xb) & 1);
                            auVar98._44_4_ =
                                 (uint)bVar49 * auVar86._44_4_ | (uint)!bVar49 * auVar82._44_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xc) & 1);
                            auVar98._48_4_ =
                                 (uint)bVar49 * auVar86._48_4_ | (uint)!bVar49 * auVar82._48_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xd) & 1);
                            auVar98._52_4_ =
                                 (uint)bVar49 * auVar86._52_4_ | (uint)!bVar49 * auVar82._52_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xe) & 1);
                            auVar98._56_4_ =
                                 (uint)bVar49 * auVar86._56_4_ | (uint)!bVar49 * auVar82._56_4_;
                            bVar49 = SUB81(uVar66 >> 0xf,0);
                            auVar98._60_4_ =
                                 (uint)bVar49 * auVar86._60_4_ | (uint)!bVar49 * auVar82._60_4_;
                            bVar49 = (bool)((byte)uVar65 & 1);
                            auVar99._0_4_ =
                                 (uint)bVar49 * auVar87._0_4_ | (uint)!bVar49 * auVar89._0_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 1) & 1);
                            auVar99._4_4_ =
                                 (uint)bVar49 * auVar87._4_4_ | (uint)!bVar49 * auVar89._4_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 2) & 1);
                            auVar99._8_4_ =
                                 (uint)bVar49 * auVar87._8_4_ | (uint)!bVar49 * auVar89._8_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 3) & 1);
                            auVar99._12_4_ =
                                 (uint)bVar49 * auVar87._12_4_ | (uint)!bVar49 * auVar89._12_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 4) & 1);
                            auVar99._16_4_ =
                                 (uint)bVar49 * auVar87._16_4_ | (uint)!bVar49 * auVar89._16_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 5) & 1);
                            auVar99._20_4_ =
                                 (uint)bVar49 * auVar87._20_4_ | (uint)!bVar49 * auVar89._20_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 6) & 1);
                            auVar99._24_4_ =
                                 (uint)bVar49 * auVar87._24_4_ | (uint)!bVar49 * auVar89._24_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 7) & 1);
                            auVar99._28_4_ =
                                 (uint)bVar49 * auVar87._28_4_ | (uint)!bVar49 * auVar89._28_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 8) & 1);
                            auVar99._32_4_ =
                                 (uint)bVar49 * auVar87._32_4_ | (uint)!bVar49 * auVar89._32_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 9) & 1);
                            auVar99._36_4_ =
                                 (uint)bVar49 * auVar87._36_4_ | (uint)!bVar49 * auVar89._36_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 10) & 1);
                            auVar99._40_4_ =
                                 (uint)bVar49 * auVar87._40_4_ | (uint)!bVar49 * auVar89._40_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xb) & 1);
                            auVar99._44_4_ =
                                 (uint)bVar49 * auVar87._44_4_ | (uint)!bVar49 * auVar89._44_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xc) & 1);
                            auVar99._48_4_ =
                                 (uint)bVar49 * auVar87._48_4_ | (uint)!bVar49 * auVar89._48_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xd) & 1);
                            auVar99._52_4_ =
                                 (uint)bVar49 * auVar87._52_4_ | (uint)!bVar49 * auVar89._52_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xe) & 1);
                            auVar99._56_4_ =
                                 (uint)bVar49 * auVar87._56_4_ | (uint)!bVar49 * auVar89._56_4_;
                            bVar49 = SUB81(uVar65 >> 0xf,0);
                            auVar99._60_4_ =
                                 (uint)bVar49 * auVar87._60_4_ | (uint)!bVar49 * auVar89._60_4_;
                            bVar49 = (bool)((byte)uVar57 & 1);
                            auVar100._0_4_ =
                                 (uint)bVar49 * auVar85._0_4_ | (uint)!bVar49 * auVar88._0_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 1) & 1);
                            auVar100._4_4_ =
                                 (uint)bVar49 * auVar85._4_4_ | (uint)!bVar49 * auVar88._4_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 2) & 1);
                            auVar100._8_4_ =
                                 (uint)bVar49 * auVar85._8_4_ | (uint)!bVar49 * auVar88._8_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 3) & 1);
                            auVar100._12_4_ =
                                 (uint)bVar49 * auVar85._12_4_ | (uint)!bVar49 * auVar88._12_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 4) & 1);
                            auVar100._16_4_ =
                                 (uint)bVar49 * auVar85._16_4_ | (uint)!bVar49 * auVar88._16_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 5) & 1);
                            auVar100._20_4_ =
                                 (uint)bVar49 * auVar85._20_4_ | (uint)!bVar49 * auVar88._20_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 6) & 1);
                            auVar100._24_4_ =
                                 (uint)bVar49 * auVar85._24_4_ | (uint)!bVar49 * auVar88._24_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 7) & 1);
                            auVar100._28_4_ =
                                 (uint)bVar49 * auVar85._28_4_ | (uint)!bVar49 * auVar88._28_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 8) & 1);
                            auVar100._32_4_ =
                                 (uint)bVar49 * auVar85._32_4_ | (uint)!bVar49 * auVar88._32_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 9) & 1);
                            auVar100._36_4_ =
                                 (uint)bVar49 * auVar85._36_4_ | (uint)!bVar49 * auVar88._36_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 10) & 1);
                            auVar100._40_4_ =
                                 (uint)bVar49 * auVar85._40_4_ | (uint)!bVar49 * auVar88._40_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xb) & 1);
                            auVar100._44_4_ =
                                 (uint)bVar49 * auVar85._44_4_ | (uint)!bVar49 * auVar88._44_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xc) & 1);
                            auVar100._48_4_ =
                                 (uint)bVar49 * auVar85._48_4_ | (uint)!bVar49 * auVar88._48_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xd) & 1);
                            auVar100._52_4_ =
                                 (uint)bVar49 * auVar85._52_4_ | (uint)!bVar49 * auVar88._52_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xe) & 1);
                            auVar100._56_4_ =
                                 (uint)bVar49 * auVar85._56_4_ | (uint)!bVar49 * auVar88._56_4_;
                            bVar49 = SUB81(uVar57 >> 0xf,0);
                            auVar100._60_4_ =
                                 (uint)bVar49 * auVar85._60_4_ | (uint)!bVar49 * auVar88._60_4_;
                            auVar77 = vmulps_avx512f(auVar77,auVar100);
                            auVar101 = vfmadd213ps_avx512f(auVar101,auVar99,auVar77);
                            auVar76 = vfmadd213ps_avx512f(auVar76,auVar98,auVar101);
                            auVar76 = vaddps_avx512f(auVar76,auVar76);
                            auVar101 = vmulps_avx512f(auVar81,auVar100);
                            auVar101 = vfmadd213ps_avx512f(auVar80,auVar99,auVar101);
                            auVar101 = vfmadd213ps_avx512f(auVar79,auVar98,auVar101);
                            auVar77 = vrcp14ps_avx512f(auVar76);
                            auVar101 = vaddps_avx512f(auVar101,auVar101);
                            auVar43._8_4_ = 0x3f800000;
                            auVar43._0_8_ = 0x3f8000003f800000;
                            auVar43._12_4_ = 0x3f800000;
                            auVar43._16_4_ = 0x3f800000;
                            auVar43._20_4_ = 0x3f800000;
                            auVar43._24_4_ = 0x3f800000;
                            auVar43._28_4_ = 0x3f800000;
                            auVar43._32_4_ = 0x3f800000;
                            auVar43._36_4_ = 0x3f800000;
                            auVar43._40_4_ = 0x3f800000;
                            auVar43._44_4_ = 0x3f800000;
                            auVar43._48_4_ = 0x3f800000;
                            auVar43._52_4_ = 0x3f800000;
                            auVar43._56_4_ = 0x3f800000;
                            auVar43._60_4_ = 0x3f800000;
                            auVar79 = vfnmadd213ps_avx512f(auVar77,auVar76,auVar43);
                            auVar77 = vfmadd132ps_avx512f(auVar79,auVar77,auVar77);
                            auVar101 = vmulps_avx512f(auVar101,auVar77);
                            uVar23 = vcmpps_avx512f(auVar101,*(undefined1 (*) [64])(ray + 0x200),2);
                            uVar24 = vcmpps_avx512f(auVar101,*(undefined1 (*) [64])(ray + 0xc0),0xd)
                            ;
                            uVar25 = vcmpps_avx512f(auVar76,auVar72,4);
                            uVar53 = uVar53 & (ushort)uVar23 & (ushort)uVar24 & (ushort)uVar25;
                            if (uVar53 == 0) goto LAB_01f6e5b0;
                            local_4a80 = auVar90;
                            local_4ac0 = auVar91;
                            local_4b00 = auVar75;
                            local_4b40 = auVar101;
                            local_4b80 = auVar98;
                            local_4bc0 = auVar99;
                            local_4c00 = auVar100;
                          }
                          pGVar2 = (context->scene->geometries).items
                                   [*(uint *)(local_5358.super_Precalculations.grid + 0x18)].ptr;
                          auVar75 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                          uVar23 = vptestmd_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x240));
                          uVar53 = (ushort)uVar23 & uVar53;
                          if (uVar53 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar75 = vpbroadcastd_avx512f();
                              auVar76 = vandps_avx512dq(local_4b00,auVar70);
                              auVar45._8_4_ = 0x219392ef;
                              auVar45._0_8_ = 0x219392ef219392ef;
                              auVar45._12_4_ = 0x219392ef;
                              auVar45._16_4_ = 0x219392ef;
                              auVar45._20_4_ = 0x219392ef;
                              auVar45._24_4_ = 0x219392ef;
                              auVar45._28_4_ = 0x219392ef;
                              auVar45._32_4_ = 0x219392ef;
                              auVar45._36_4_ = 0x219392ef;
                              auVar45._40_4_ = 0x219392ef;
                              auVar45._44_4_ = 0x219392ef;
                              auVar45._48_4_ = 0x219392ef;
                              auVar45._52_4_ = 0x219392ef;
                              auVar45._56_4_ = 0x219392ef;
                              auVar45._60_4_ = 0x219392ef;
                              uVar66 = vcmpps_avx512f(auVar76,auVar45,5);
                              auVar76 = vrcp14ps_avx512f(local_4b00);
                              auVar101 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                              auVar77 = vfnmadd213ps_avx512f(auVar76,local_4b00,auVar101);
                              auVar76 = vfmadd132ps_avx512f(auVar77,auVar76,auVar76);
                              auVar105._4_4_ = (uint)((byte)(uVar66 >> 1) & 1) * auVar76._4_4_;
                              auVar105._0_4_ = (uint)((byte)uVar66 & 1) * auVar76._0_4_;
                              auVar105._8_4_ = (uint)((byte)(uVar66 >> 2) & 1) * auVar76._8_4_;
                              auVar105._12_4_ = (uint)((byte)(uVar66 >> 3) & 1) * auVar76._12_4_;
                              auVar105._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar76._16_4_;
                              auVar105._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar76._20_4_;
                              auVar105._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar76._24_4_;
                              auVar105._28_4_ = (uint)((byte)(uVar66 >> 7) & 1) * auVar76._28_4_;
                              auVar105._32_4_ = (uint)((byte)(uVar66 >> 8) & 1) * auVar76._32_4_;
                              auVar105._36_4_ = (uint)((byte)(uVar66 >> 9) & 1) * auVar76._36_4_;
                              auVar105._40_4_ = (uint)((byte)(uVar66 >> 10) & 1) * auVar76._40_4_;
                              auVar105._44_4_ = (uint)((byte)(uVar66 >> 0xb) & 1) * auVar76._44_4_;
                              auVar105._48_4_ = (uint)((byte)(uVar66 >> 0xc) & 1) * auVar76._48_4_;
                              auVar105._52_4_ = (uint)((byte)(uVar66 >> 0xd) & 1) * auVar76._52_4_;
                              auVar105._56_4_ = (uint)((byte)(uVar66 >> 0xe) & 1) * auVar76._56_4_;
                              auVar105._60_4_ = (uint)(byte)(uVar66 >> 0xf) * auVar76._60_4_;
                              auVar76 = vmulps_avx512f(auVar105,local_4a80);
                              auVar76 = vminps_avx512f(auVar76,auVar101);
                              auVar77 = vmulps_avx512f(auVar105,local_4ac0);
                              auVar77 = vminps_avx512f(auVar77,auVar101);
                              auVar79 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5340 + lVar55 + 0x2c)));
                              auVar80 = vpsrld_avx512f(auVar79,0x10);
                              auVar81 = vmovdqu16_avx512bw(auVar72);
                              auVar106._2_2_ = auVar81._2_2_;
                              auVar106._0_2_ = auVar79._0_2_;
                              auVar106._4_2_ = auVar79._4_2_;
                              auVar106._6_2_ = auVar81._6_2_;
                              auVar106._8_2_ = auVar79._8_2_;
                              auVar106._10_2_ = auVar81._10_2_;
                              auVar106._12_2_ = auVar79._12_2_;
                              auVar106._14_2_ = auVar81._14_2_;
                              auVar106._16_2_ = auVar79._16_2_;
                              auVar106._18_2_ = auVar81._18_2_;
                              auVar106._20_2_ = auVar79._20_2_;
                              auVar106._22_2_ = auVar81._22_2_;
                              auVar106._24_2_ = auVar79._24_2_;
                              auVar106._26_2_ = auVar81._26_2_;
                              auVar106._28_2_ = auVar79._28_2_;
                              auVar106._30_2_ = auVar81._30_2_;
                              auVar106._32_2_ = auVar79._32_2_;
                              auVar106._34_2_ = auVar81._34_2_;
                              auVar106._36_2_ = auVar79._36_2_;
                              auVar106._38_2_ = auVar81._38_2_;
                              auVar106._40_2_ = auVar79._40_2_;
                              auVar106._42_2_ = auVar81._42_2_;
                              auVar106._44_2_ = auVar79._44_2_;
                              auVar106._46_2_ = auVar81._46_2_;
                              auVar106._48_2_ = auVar79._48_2_;
                              auVar106._50_2_ = auVar81._50_2_;
                              auVar106._52_2_ = auVar79._52_2_;
                              auVar106._54_2_ = auVar81._54_2_;
                              auVar106._56_2_ = auVar79._56_2_;
                              auVar106._58_2_ = auVar81._58_2_;
                              auVar106._62_2_ = auVar81._62_2_;
                              auVar106._60_2_ = auVar79._60_2_;
                              auVar79 = vcvtdq2ps_avx512f(auVar106);
                              auVar81 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                              auVar79 = vmulps_avx512f(auVar79,auVar81);
                              auVar80 = vcvtdq2ps_avx512f(auVar80);
                              auVar80 = vmulps_avx512f(auVar80,auVar81);
                              auVar82 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5340 + lVar55 + 0x30)));
                              auVar83 = vpsrld_avx512f(auVar82,0x10);
                              auVar84 = vmovdqu16_avx512bw(auVar72);
                              auVar107._2_2_ = auVar84._2_2_;
                              auVar107._0_2_ = auVar82._0_2_;
                              auVar107._4_2_ = auVar82._4_2_;
                              auVar107._6_2_ = auVar84._6_2_;
                              auVar107._8_2_ = auVar82._8_2_;
                              auVar107._10_2_ = auVar84._10_2_;
                              auVar107._12_2_ = auVar82._12_2_;
                              auVar107._14_2_ = auVar84._14_2_;
                              auVar107._16_2_ = auVar82._16_2_;
                              auVar107._18_2_ = auVar84._18_2_;
                              auVar107._20_2_ = auVar82._20_2_;
                              auVar107._22_2_ = auVar84._22_2_;
                              auVar107._24_2_ = auVar82._24_2_;
                              auVar107._26_2_ = auVar84._26_2_;
                              auVar107._28_2_ = auVar82._28_2_;
                              auVar107._30_2_ = auVar84._30_2_;
                              auVar107._32_2_ = auVar82._32_2_;
                              auVar107._34_2_ = auVar84._34_2_;
                              auVar107._36_2_ = auVar82._36_2_;
                              auVar107._38_2_ = auVar84._38_2_;
                              auVar107._40_2_ = auVar82._40_2_;
                              auVar107._42_2_ = auVar84._42_2_;
                              auVar107._44_2_ = auVar82._44_2_;
                              auVar107._46_2_ = auVar84._46_2_;
                              auVar107._48_2_ = auVar82._48_2_;
                              auVar107._50_2_ = auVar84._50_2_;
                              auVar107._52_2_ = auVar82._52_2_;
                              auVar107._54_2_ = auVar84._54_2_;
                              auVar107._56_2_ = auVar82._56_2_;
                              auVar107._58_2_ = auVar84._58_2_;
                              auVar107._62_2_ = auVar84._62_2_;
                              auVar107._60_2_ = auVar82._60_2_;
                              auVar82 = vcvtdq2ps_avx512f(auVar107);
                              auVar82 = vmulps_avx512f(auVar82,auVar81);
                              auVar83 = vcvtdq2ps_avx512f(auVar83);
                              auVar83 = vmulps_avx512f(auVar83,auVar81);
                              auVar84 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5338 + lVar55 + 0x2c)));
                              auVar101 = vsubps_avx512f(auVar101,auVar76);
                              auVar101 = vsubps_avx512f(auVar101,auVar77);
                              auVar79 = vmulps_avx512f(auVar101,auVar79);
                              auVar101 = vmulps_avx512f(auVar101,auVar80);
                              auVar80 = vpsrld_avx512f(auVar84,0x10);
                              auVar85 = vmovdqu16_avx512bw(auVar72);
                              auVar108._2_2_ = auVar85._2_2_;
                              auVar108._0_2_ = auVar84._0_2_;
                              auVar108._4_2_ = auVar84._4_2_;
                              auVar108._6_2_ = auVar85._6_2_;
                              auVar108._8_2_ = auVar84._8_2_;
                              auVar108._10_2_ = auVar85._10_2_;
                              auVar108._12_2_ = auVar84._12_2_;
                              auVar108._14_2_ = auVar85._14_2_;
                              auVar108._16_2_ = auVar84._16_2_;
                              auVar108._18_2_ = auVar85._18_2_;
                              auVar108._20_2_ = auVar84._20_2_;
                              auVar108._22_2_ = auVar85._22_2_;
                              auVar108._24_2_ = auVar84._24_2_;
                              auVar108._26_2_ = auVar85._26_2_;
                              auVar108._28_2_ = auVar84._28_2_;
                              auVar108._30_2_ = auVar85._30_2_;
                              auVar108._32_2_ = auVar84._32_2_;
                              auVar108._34_2_ = auVar85._34_2_;
                              auVar108._36_2_ = auVar84._36_2_;
                              auVar108._38_2_ = auVar85._38_2_;
                              auVar108._40_2_ = auVar84._40_2_;
                              auVar108._42_2_ = auVar85._42_2_;
                              auVar108._44_2_ = auVar84._44_2_;
                              auVar108._46_2_ = auVar85._46_2_;
                              auVar108._48_2_ = auVar84._48_2_;
                              auVar108._50_2_ = auVar85._50_2_;
                              auVar108._52_2_ = auVar84._52_2_;
                              auVar108._54_2_ = auVar85._54_2_;
                              auVar108._56_2_ = auVar84._56_2_;
                              auVar108._58_2_ = auVar85._58_2_;
                              auVar108._62_2_ = auVar85._62_2_;
                              auVar108._60_2_ = auVar84._60_2_;
                              auVar84 = vcvtdq2ps_avx512f(auVar108);
                              auVar84 = vmulps_avx512f(auVar84,auVar81);
                              auVar80 = vcvtdq2ps_avx512f(auVar80);
                              auVar80 = vmulps_avx512f(auVar80,auVar81);
                              auVar79 = vfmadd231ps_avx512f(auVar79,auVar77,auVar84);
                              auVar101 = vfmadd231ps_avx512f(auVar101,auVar77,auVar80);
                              local_4f80 = vfmadd231ps_avx512f(auVar79,auVar76,auVar82);
                              local_4f40 = vfmadd231ps_avx512f(auVar101,auVar76,auVar83);
                              auVar76 = vpbroadcastd_avx512f();
                              pRVar3 = context->user;
                              local_5040 = local_4b80._0_8_;
                              uStack_5038 = local_4b80._8_8_;
                              uStack_5030 = local_4b80._16_8_;
                              uStack_5028 = local_4b80._24_8_;
                              uStack_5020 = local_4b80._32_8_;
                              uStack_5018 = local_4b80._40_8_;
                              uStack_5010 = local_4b80._48_8_;
                              uStack_5008 = local_4b80._56_8_;
                              local_5000 = local_4bc0._0_8_;
                              uStack_4ff8 = local_4bc0._8_8_;
                              uStack_4ff0 = local_4bc0._16_8_;
                              uStack_4fe8 = local_4bc0._24_8_;
                              uStack_4fe0 = local_4bc0._32_8_;
                              uStack_4fd8 = local_4bc0._40_8_;
                              uStack_4fd0 = local_4bc0._48_8_;
                              uStack_4fc8 = local_4bc0._56_8_;
                              local_4fc0 = local_4c00._0_8_;
                              uStack_4fb8 = local_4c00._8_8_;
                              uStack_4fb0 = local_4c00._16_8_;
                              uStack_4fa8 = local_4c00._24_8_;
                              uStack_4fa0 = local_4c00._32_8_;
                              uStack_4f98 = local_4c00._40_8_;
                              uStack_4f90 = local_4c00._48_8_;
                              uStack_4f88 = local_4c00._56_8_;
                              local_4f00 = vmovdqa64_avx512f(auVar76);
                              local_4ec0 = vmovdqa64_avx512f(auVar75);
                              auVar21 = vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                              local_5348[3] = auVar21;
                              local_5348[2] = auVar21;
                              local_5348[1] = auVar21;
                              *local_5348 = auVar21;
                              local_4e80 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                              local_4e40 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                              local_5180 = *(undefined1 (*) [64])(ray + 0x200);
                              auVar75 = vblendmps_avx512f(local_5180,local_4b40);
                              bVar49 = (bool)((byte)uVar53 & 1);
                              bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                              bVar12 = (byte)(uVar53 >> 8);
                              bVar13 = (bool)(bVar12 >> 1 & 1);
                              bVar14 = (bool)(bVar12 >> 2 & 1);
                              bVar15 = (bool)(bVar12 >> 3 & 1);
                              bVar16 = (bool)(bVar12 >> 4 & 1);
                              bVar17 = (bool)(bVar12 >> 5 & 1);
                              bVar18 = (bool)(bVar12 >> 6 & 1);
                              *(uint *)(ray + 0x200) =
                                   (uint)bVar49 * auVar75._0_4_ | (uint)!bVar49 * local_4e40._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar5 * auVar75._4_4_ | (uint)!bVar5 * local_4e40._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar6 * auVar75._8_4_ | (uint)!bVar6 * local_4e40._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar7 * auVar75._12_4_ | (uint)!bVar7 * local_4e40._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar8 * auVar75._16_4_ | (uint)!bVar8 * local_4e40._16_4_;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar9 * auVar75._20_4_ | (uint)!bVar9 * local_4e40._20_4_;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar10 * auVar75._24_4_ | (uint)!bVar10 * local_4e40._24_4_
                              ;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar11 * auVar75._28_4_ | (uint)!bVar11 * local_4e40._28_4_
                              ;
                              *(uint *)(ray + 0x220) =
                                   (uint)(bVar12 & 1) * auVar75._32_4_ |
                                   (uint)!(bool)(bVar12 & 1) * local_4e40._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar13 * auVar75._36_4_ | (uint)!bVar13 * local_4e40._36_4_
                              ;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar14 * auVar75._40_4_ | (uint)!bVar14 * local_4e40._40_4_
                              ;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar15 * auVar75._44_4_ | (uint)!bVar15 * local_4e40._44_4_
                              ;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar16 * auVar75._48_4_ | (uint)!bVar16 * local_4e40._48_4_
                              ;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar17 * auVar75._52_4_ | (uint)!bVar17 * local_4e40._52_4_
                              ;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar18 * auVar75._56_4_ | (uint)!bVar18 * local_4e40._56_4_
                              ;
                              *(uint *)(ray + 0x23c) =
                                   (uint)(bVar12 >> 7) * auVar75._60_4_ |
                                   (uint)!(bool)(bVar12 >> 7) * local_4e40._60_4_;
                              auVar75 = vpmovm2d_avx512dq((ulong)uVar53);
                              local_5200 = vmovdqa64_avx512f(auVar75);
                              local_5330.valid = (int *)local_5200;
                              local_5330.geometryUserPtr = pGVar2->userPtr;
                              local_5330.context = context->user;
                              local_5330.hit = (RTCHitN *)&local_5040;
                              local_5330.N = 0x10;
                              local_5330.ray = (RTCRayN *)ray;
                              local_5140 = auVar73;
                              local_5100 = auVar74;
                              local_50c0 = auVar78;
                              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar2->occlusionFilterN)(&local_5330);
                                auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                auVar72 = ZEXT1664(auVar68);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar75 = vmovdqa64_avx512f(local_5200);
                              }
                              auVar68 = auVar72._0_16_;
                              uVar23 = vptestmd_avx512f(auVar75,auVar75);
                              if ((short)uVar23 == 0) {
                                uVar66 = 0;
                              }
                              else {
                                p_Var4 = context->args->filter;
                                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var4)(&local_5330);
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                  auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                  auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                  auVar72 = ZEXT1664(auVar68);
                                  auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                  auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                  auVar75 = vmovdqa64_avx512f(local_5200);
                                }
                                uVar66 = vptestmd_avx512f(auVar75,auVar75);
                                auVar73 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar49 = (bool)((byte)uVar66 & 1);
                                bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                                bVar6 = (bool)((byte)(uVar66 >> 2) & 1);
                                bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
                                bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                                bVar9 = (bool)((byte)(uVar66 >> 5) & 1);
                                bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
                                bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                                bVar13 = (bool)((byte)(uVar66 >> 8) & 1);
                                bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
                                bVar15 = (bool)((byte)(uVar66 >> 10) & 1);
                                bVar16 = (bool)((byte)(uVar66 >> 0xb) & 1);
                                bVar17 = (bool)((byte)(uVar66 >> 0xc) & 1);
                                bVar18 = (bool)((byte)(uVar66 >> 0xd) & 1);
                                bVar19 = (bool)((byte)(uVar66 >> 0xe) & 1);
                                bVar20 = SUB81(uVar66 >> 0xf,0);
                                *(uint *)(local_5330.ray + 0x200) =
                                     (uint)bVar49 * auVar73._0_4_ |
                                     (uint)!bVar49 * *(int *)(local_5330.ray + 0x200);
                                *(uint *)(local_5330.ray + 0x204) =
                                     (uint)bVar5 * auVar73._4_4_ |
                                     (uint)!bVar5 * *(int *)(local_5330.ray + 0x204);
                                *(uint *)(local_5330.ray + 0x208) =
                                     (uint)bVar6 * auVar73._8_4_ |
                                     (uint)!bVar6 * *(int *)(local_5330.ray + 0x208);
                                *(uint *)(local_5330.ray + 0x20c) =
                                     (uint)bVar7 * auVar73._12_4_ |
                                     (uint)!bVar7 * *(int *)(local_5330.ray + 0x20c);
                                *(uint *)(local_5330.ray + 0x210) =
                                     (uint)bVar8 * auVar73._16_4_ |
                                     (uint)!bVar8 * *(int *)(local_5330.ray + 0x210);
                                *(uint *)(local_5330.ray + 0x214) =
                                     (uint)bVar9 * auVar73._20_4_ |
                                     (uint)!bVar9 * *(int *)(local_5330.ray + 0x214);
                                *(uint *)(local_5330.ray + 0x218) =
                                     (uint)bVar10 * auVar73._24_4_ |
                                     (uint)!bVar10 * *(int *)(local_5330.ray + 0x218);
                                *(uint *)(local_5330.ray + 0x21c) =
                                     (uint)bVar11 * auVar73._28_4_ |
                                     (uint)!bVar11 * *(int *)(local_5330.ray + 0x21c);
                                *(uint *)(local_5330.ray + 0x220) =
                                     (uint)bVar13 * auVar73._32_4_ |
                                     (uint)!bVar13 * *(int *)(local_5330.ray + 0x220);
                                *(uint *)(local_5330.ray + 0x224) =
                                     (uint)bVar14 * auVar73._36_4_ |
                                     (uint)!bVar14 * *(int *)(local_5330.ray + 0x224);
                                *(uint *)(local_5330.ray + 0x228) =
                                     (uint)bVar15 * auVar73._40_4_ |
                                     (uint)!bVar15 * *(int *)(local_5330.ray + 0x228);
                                *(uint *)(local_5330.ray + 0x22c) =
                                     (uint)bVar16 * auVar73._44_4_ |
                                     (uint)!bVar16 * *(int *)(local_5330.ray + 0x22c);
                                *(uint *)(local_5330.ray + 0x230) =
                                     (uint)bVar17 * auVar73._48_4_ |
                                     (uint)!bVar17 * *(int *)(local_5330.ray + 0x230);
                                *(uint *)(local_5330.ray + 0x234) =
                                     (uint)bVar18 * auVar73._52_4_ |
                                     (uint)!bVar18 * *(int *)(local_5330.ray + 0x234);
                                *(uint *)(local_5330.ray + 0x238) =
                                     (uint)bVar19 * auVar73._56_4_ |
                                     (uint)!bVar19 * *(int *)(local_5330.ray + 0x238);
                                *(uint *)(local_5330.ray + 0x23c) =
                                     (uint)bVar20 * auVar73._60_4_ |
                                     (uint)!bVar20 * *(int *)(local_5330.ray + 0x23c);
                              }
                              uVar53 = (ushort)uVar66;
                              bVar49 = (bool)((byte)uVar66 & 1);
                              bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar66 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar66 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                              bVar13 = (bool)((byte)(uVar66 >> 8) & 1);
                              bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
                              bVar15 = (bool)((byte)(uVar66 >> 10) & 1);
                              bVar16 = (bool)((byte)(uVar66 >> 0xb) & 1);
                              bVar17 = (bool)((byte)(uVar66 >> 0xc) & 1);
                              bVar18 = (bool)((byte)(uVar66 >> 0xd) & 1);
                              bVar19 = (bool)((byte)(uVar66 >> 0xe) & 1);
                              bVar20 = SUB81(uVar66 >> 0xf,0);
                              *(uint *)pRVar1 =
                                   (uint)bVar49 * *(int *)pRVar1 | (uint)!bVar49 * local_5180._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar5 * *(int *)(ray + 0x204) |
                                   (uint)!bVar5 * local_5180._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar6 * *(int *)(ray + 0x208) |
                                   (uint)!bVar6 * local_5180._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar7 * *(int *)(ray + 0x20c) |
                                   (uint)!bVar7 * local_5180._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar8 * *(int *)(ray + 0x210) |
                                   (uint)!bVar8 * local_5180._16_4_;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar9 * *(int *)(ray + 0x214) |
                                   (uint)!bVar9 * local_5180._20_4_;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar10 * *(int *)(ray + 0x218) |
                                   (uint)!bVar10 * local_5180._24_4_;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar11 * *(int *)(ray + 0x21c) |
                                   (uint)!bVar11 * local_5180._28_4_;
                              *(uint *)(ray + 0x220) =
                                   (uint)bVar13 * *(int *)(ray + 0x220) |
                                   (uint)!bVar13 * local_5180._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar14 * *(int *)(ray + 0x224) |
                                   (uint)!bVar14 * local_5180._36_4_;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar15 * *(int *)(ray + 0x228) |
                                   (uint)!bVar15 * local_5180._40_4_;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar16 * *(int *)(ray + 0x22c) |
                                   (uint)!bVar16 * local_5180._44_4_;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar17 * *(int *)(ray + 0x230) |
                                   (uint)!bVar17 * local_5180._48_4_;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar18 * *(int *)(ray + 0x234) |
                                   (uint)!bVar18 * local_5180._52_4_;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar19 * *(int *)(ray + 0x238) |
                                   (uint)!bVar19 * local_5180._56_4_;
                              *(uint *)(ray + 0x23c) =
                                   (uint)bVar20 * *(int *)(ray + 0x23c) |
                                   (uint)!bVar20 * local_5180._60_4_;
                              auVar73 = local_5140;
                              auVar78 = local_50c0;
                              auVar74 = local_5100;
                            }
                            uVar50 = uVar50 & (ushort)~uVar53;
                          }
                          auVar68 = auVar72._0_16_;
                          if ((ushort)uVar50 == 0) break;
                          auVar75 = *(undefined1 (*) [64])ray;
                          auVar76 = *(undefined1 (*) [64])(ray + 0x40);
                          auVar101 = *(undefined1 (*) [64])(ray + 0x80);
                          auVar77 = *(undefined1 (*) [64])(ray + 0x100);
                          auVar79 = *(undefined1 (*) [64])(ray + 0x140);
                          auVar80 = *(undefined1 (*) [64])(ray + 0x180);
                          auVar81 = vsubps_avx512f(local_4900,auVar75);
                          auVar82 = vsubps_avx512f(local_4940,auVar76);
                          auVar83 = vsubps_avx512f(local_4980,auVar101);
                          auVar78 = vsubps_avx512f(auVar78,auVar75);
                          auVar84 = vsubps_avx512f(local_5240,auVar76);
                          auVar85 = vsubps_avx512f(local_51c0,auVar101);
                          auVar75 = vsubps_avx512f(local_49c0,auVar75);
                          auVar74 = vsubps_avx512f(auVar74,auVar76);
                          auVar73 = vsubps_avx512f(auVar73,auVar101);
                          auVar76 = vsubps_avx512f(auVar75,auVar81);
                          auVar101 = vsubps_avx512f(auVar74,auVar82);
                          auVar86 = vsubps_avx512f(auVar73,auVar83);
                          auVar87 = vsubps_avx512f(auVar81,auVar78);
                          in_ZMM16 = vsubps_avx512f(auVar82,auVar84);
                          auVar88 = vsubps_avx512f(auVar83,auVar85);
                          auVar89 = vsubps_avx512f(auVar78,auVar75);
                          auVar90 = vsubps_avx512f(auVar84,auVar74);
                          auVar91 = vsubps_avx512f(auVar85,auVar73);
                          auVar92 = vaddps_avx512f(auVar75,auVar81);
                          auVar93 = vaddps_avx512f(auVar74,auVar82);
                          auVar94 = vaddps_avx512f(auVar73,auVar83);
                          auVar95 = vmulps_avx512f(auVar93,auVar86);
                          auVar95 = vfmsub231ps_avx512f(auVar95,auVar101,auVar94);
                          auVar94 = vmulps_avx512f(auVar94,auVar76);
                          auVar94 = vfmsub231ps_avx512f(auVar94,auVar86,auVar92);
                          auVar92 = vmulps_avx512f(auVar92,auVar101);
                          auVar92 = vfmsub231ps_avx512f(auVar92,auVar76,auVar93);
                          auVar92 = vmulps_avx512f(auVar92,auVar80);
                          auVar92 = vfmadd231ps_avx512f(auVar92,auVar79,auVar94);
                          auVar92 = vfmadd231ps_avx512f(auVar92,auVar77,auVar95);
                          auVar93 = vaddps_avx512f(auVar81,auVar78);
                          auVar94 = vaddps_avx512f(auVar82,auVar84);
                          auVar95 = vaddps_avx512f(auVar83,auVar85);
                          auVar96 = vmulps_avx512f(auVar94,auVar88);
                          auVar96 = vfmsub231ps_avx512f(auVar96,in_ZMM16,auVar95);
                          auVar95 = vmulps_avx512f(auVar95,auVar87);
                          auVar95 = vfmsub231ps_avx512f(auVar95,auVar88,auVar93);
                          auVar93 = vmulps_avx512f(auVar93,in_ZMM16);
                          auVar93 = vfmsub231ps_avx512f(auVar93,auVar87,auVar94);
                          auVar93 = vmulps_avx512f(auVar93,auVar80);
                          auVar93 = vfmadd231ps_avx512f(auVar93,auVar79,auVar95);
                          auVar93 = vfmadd231ps_avx512f(auVar93,auVar77,auVar96);
                          auVar75 = vaddps_avx512f(auVar78,auVar75);
                          auVar74 = vaddps_avx512f(auVar84,auVar74);
                          auVar73 = vaddps_avx512f(auVar85,auVar73);
                          auVar78 = vmulps_avx512f(auVar74,auVar91);
                          auVar78 = vfmsub231ps_avx512f(auVar78,auVar90,auVar73);
                          auVar73 = vmulps_avx512f(auVar73,auVar89);
                          auVar73 = vfmsub231ps_avx512f(auVar73,auVar91,auVar75);
                          auVar75 = vmulps_avx512f(auVar75,auVar90);
                          auVar74 = vfmsub231ps_avx512f(auVar75,auVar89,auVar74);
                          auVar74 = vmulps_avx512f(auVar74,auVar80);
                          auVar73 = vfmadd231ps_avx512f(auVar74,auVar79,auVar73);
                          auVar73 = vfmadd231ps_avx512f(auVar73,auVar77,auVar78);
                          auVar74 = vaddps_avx512f(auVar92,auVar93);
                          auVar74 = vaddps_avx512f(auVar73,auVar74);
                          auVar75 = vandps_avx512dq(auVar74,auVar70);
                          auVar75 = vmulps_avx512f(auVar75,auVar128);
                          auVar78 = vminps_avx512f(auVar92,auVar93);
                          auVar78 = vminps_avx512f(auVar78,auVar73);
                          auVar84 = vxorps_avx512dq(auVar75,auVar69);
                          uVar23 = vcmpps_avx512f(auVar78,auVar84,5);
                          auVar78 = vmaxps_avx512f(auVar92,auVar93);
                          auVar73 = vmaxps_avx512f(auVar78,auVar73);
                          uVar24 = vcmpps_avx512f(auVar73,auVar75,2);
                          uVar53 = ((ushort)uVar23 | (ushort)uVar24) & (ushort)uVar50;
                          if (uVar53 == 0) {
LAB_01f6e96e:
                            uVar53 = 0;
                          }
                          else {
                            auVar73 = vmulps_avx512f(in_ZMM16,auVar86);
                            auVar75 = vmulps_avx512f(auVar76,auVar88);
                            auVar78 = vmulps_avx512f(auVar87,auVar101);
                            auVar84 = vmulps_avx512f(auVar90,auVar88);
                            auVar85 = vmulps_avx512f(auVar87,auVar91);
                            auVar94 = vmulps_avx512f(auVar89,in_ZMM16);
                            auVar101 = vfmsub213ps_avx512f(auVar101,auVar88,auVar73);
                            auVar86 = vfmsub213ps_avx512f(auVar86,auVar87,auVar75);
                            auVar76 = vfmsub213ps_avx512f(auVar76,in_ZMM16,auVar78);
                            auVar91 = vfmsub213ps_avx512f(auVar91,in_ZMM16,auVar84);
                            auVar88 = vfmsub213ps_avx512f(auVar89,auVar88,auVar85);
                            auVar87 = vfmsub213ps_avx512f(auVar90,auVar87,auVar94);
                            auVar73 = vandps_avx512dq(auVar73,auVar70);
                            auVar84 = vandps_avx512dq(auVar84,auVar70);
                            uVar66 = vcmpps_avx512f(auVar73,auVar84,1);
                            auVar73 = vandps_avx512dq(auVar75,auVar70);
                            auVar75 = vandps_avx512dq(auVar85,auVar70);
                            uVar65 = vcmpps_avx512f(auVar73,auVar75,1);
                            auVar73 = vandps_avx512dq(auVar78,auVar70);
                            auVar75 = vandps_avx512dq(auVar94,auVar70);
                            uVar57 = vcmpps_avx512f(auVar73,auVar75,1);
                            bVar49 = (bool)((byte)uVar66 & 1);
                            auVar102._0_4_ =
                                 (uint)bVar49 * auVar101._0_4_ | (uint)!bVar49 * auVar91._0_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 1) & 1);
                            auVar102._4_4_ =
                                 (uint)bVar49 * auVar101._4_4_ | (uint)!bVar49 * auVar91._4_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 2) & 1);
                            auVar102._8_4_ =
                                 (uint)bVar49 * auVar101._8_4_ | (uint)!bVar49 * auVar91._8_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 3) & 1);
                            auVar102._12_4_ =
                                 (uint)bVar49 * auVar101._12_4_ | (uint)!bVar49 * auVar91._12_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 4) & 1);
                            auVar102._16_4_ =
                                 (uint)bVar49 * auVar101._16_4_ | (uint)!bVar49 * auVar91._16_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 5) & 1);
                            auVar102._20_4_ =
                                 (uint)bVar49 * auVar101._20_4_ | (uint)!bVar49 * auVar91._20_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 6) & 1);
                            auVar102._24_4_ =
                                 (uint)bVar49 * auVar101._24_4_ | (uint)!bVar49 * auVar91._24_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 7) & 1);
                            auVar102._28_4_ =
                                 (uint)bVar49 * auVar101._28_4_ | (uint)!bVar49 * auVar91._28_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 8) & 1);
                            auVar102._32_4_ =
                                 (uint)bVar49 * auVar101._32_4_ | (uint)!bVar49 * auVar91._32_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 9) & 1);
                            auVar102._36_4_ =
                                 (uint)bVar49 * auVar101._36_4_ | (uint)!bVar49 * auVar91._36_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 10) & 1);
                            auVar102._40_4_ =
                                 (uint)bVar49 * auVar101._40_4_ | (uint)!bVar49 * auVar91._40_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xb) & 1);
                            auVar102._44_4_ =
                                 (uint)bVar49 * auVar101._44_4_ | (uint)!bVar49 * auVar91._44_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xc) & 1);
                            auVar102._48_4_ =
                                 (uint)bVar49 * auVar101._48_4_ | (uint)!bVar49 * auVar91._48_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xd) & 1);
                            auVar102._52_4_ =
                                 (uint)bVar49 * auVar101._52_4_ | (uint)!bVar49 * auVar91._52_4_;
                            bVar49 = (bool)((byte)(uVar66 >> 0xe) & 1);
                            auVar102._56_4_ =
                                 (uint)bVar49 * auVar101._56_4_ | (uint)!bVar49 * auVar91._56_4_;
                            bVar49 = SUB81(uVar66 >> 0xf,0);
                            auVar102._60_4_ =
                                 (uint)bVar49 * auVar101._60_4_ | (uint)!bVar49 * auVar91._60_4_;
                            bVar49 = (bool)((byte)uVar65 & 1);
                            auVar103._0_4_ =
                                 (uint)bVar49 * auVar86._0_4_ | (uint)!bVar49 * auVar88._0_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 1) & 1);
                            auVar103._4_4_ =
                                 (uint)bVar49 * auVar86._4_4_ | (uint)!bVar49 * auVar88._4_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 2) & 1);
                            auVar103._8_4_ =
                                 (uint)bVar49 * auVar86._8_4_ | (uint)!bVar49 * auVar88._8_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 3) & 1);
                            auVar103._12_4_ =
                                 (uint)bVar49 * auVar86._12_4_ | (uint)!bVar49 * auVar88._12_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 4) & 1);
                            auVar103._16_4_ =
                                 (uint)bVar49 * auVar86._16_4_ | (uint)!bVar49 * auVar88._16_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 5) & 1);
                            auVar103._20_4_ =
                                 (uint)bVar49 * auVar86._20_4_ | (uint)!bVar49 * auVar88._20_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 6) & 1);
                            auVar103._24_4_ =
                                 (uint)bVar49 * auVar86._24_4_ | (uint)!bVar49 * auVar88._24_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 7) & 1);
                            auVar103._28_4_ =
                                 (uint)bVar49 * auVar86._28_4_ | (uint)!bVar49 * auVar88._28_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 8) & 1);
                            auVar103._32_4_ =
                                 (uint)bVar49 * auVar86._32_4_ | (uint)!bVar49 * auVar88._32_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 9) & 1);
                            auVar103._36_4_ =
                                 (uint)bVar49 * auVar86._36_4_ | (uint)!bVar49 * auVar88._36_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 10) & 1);
                            auVar103._40_4_ =
                                 (uint)bVar49 * auVar86._40_4_ | (uint)!bVar49 * auVar88._40_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xb) & 1);
                            auVar103._44_4_ =
                                 (uint)bVar49 * auVar86._44_4_ | (uint)!bVar49 * auVar88._44_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xc) & 1);
                            auVar103._48_4_ =
                                 (uint)bVar49 * auVar86._48_4_ | (uint)!bVar49 * auVar88._48_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xd) & 1);
                            auVar103._52_4_ =
                                 (uint)bVar49 * auVar86._52_4_ | (uint)!bVar49 * auVar88._52_4_;
                            bVar49 = (bool)((byte)(uVar65 >> 0xe) & 1);
                            auVar103._56_4_ =
                                 (uint)bVar49 * auVar86._56_4_ | (uint)!bVar49 * auVar88._56_4_;
                            bVar49 = SUB81(uVar65 >> 0xf,0);
                            auVar103._60_4_ =
                                 (uint)bVar49 * auVar86._60_4_ | (uint)!bVar49 * auVar88._60_4_;
                            bVar49 = (bool)((byte)uVar57 & 1);
                            auVar104._0_4_ =
                                 (uint)bVar49 * auVar76._0_4_ | (uint)!bVar49 * auVar87._0_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 1) & 1);
                            auVar104._4_4_ =
                                 (uint)bVar49 * auVar76._4_4_ | (uint)!bVar49 * auVar87._4_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 2) & 1);
                            auVar104._8_4_ =
                                 (uint)bVar49 * auVar76._8_4_ | (uint)!bVar49 * auVar87._8_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 3) & 1);
                            auVar104._12_4_ =
                                 (uint)bVar49 * auVar76._12_4_ | (uint)!bVar49 * auVar87._12_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 4) & 1);
                            auVar104._16_4_ =
                                 (uint)bVar49 * auVar76._16_4_ | (uint)!bVar49 * auVar87._16_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 5) & 1);
                            auVar104._20_4_ =
                                 (uint)bVar49 * auVar76._20_4_ | (uint)!bVar49 * auVar87._20_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 6) & 1);
                            auVar104._24_4_ =
                                 (uint)bVar49 * auVar76._24_4_ | (uint)!bVar49 * auVar87._24_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 7) & 1);
                            auVar104._28_4_ =
                                 (uint)bVar49 * auVar76._28_4_ | (uint)!bVar49 * auVar87._28_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 8) & 1);
                            auVar104._32_4_ =
                                 (uint)bVar49 * auVar76._32_4_ | (uint)!bVar49 * auVar87._32_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 9) & 1);
                            auVar104._36_4_ =
                                 (uint)bVar49 * auVar76._36_4_ | (uint)!bVar49 * auVar87._36_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 10) & 1);
                            auVar104._40_4_ =
                                 (uint)bVar49 * auVar76._40_4_ | (uint)!bVar49 * auVar87._40_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xb) & 1);
                            auVar104._44_4_ =
                                 (uint)bVar49 * auVar76._44_4_ | (uint)!bVar49 * auVar87._44_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xc) & 1);
                            auVar104._48_4_ =
                                 (uint)bVar49 * auVar76._48_4_ | (uint)!bVar49 * auVar87._48_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xd) & 1);
                            auVar104._52_4_ =
                                 (uint)bVar49 * auVar76._52_4_ | (uint)!bVar49 * auVar87._52_4_;
                            bVar49 = (bool)((byte)(uVar57 >> 0xe) & 1);
                            auVar104._56_4_ =
                                 (uint)bVar49 * auVar76._56_4_ | (uint)!bVar49 * auVar87._56_4_;
                            bVar49 = SUB81(uVar57 >> 0xf,0);
                            auVar104._60_4_ =
                                 (uint)bVar49 * auVar76._60_4_ | (uint)!bVar49 * auVar87._60_4_;
                            auVar73 = vmulps_avx512f(auVar80,auVar104);
                            auVar73 = vfmadd213ps_avx512f(auVar79,auVar103,auVar73);
                            auVar73 = vfmadd213ps_avx512f(auVar77,auVar102,auVar73);
                            auVar73 = vaddps_avx512f(auVar73,auVar73);
                            auVar75 = vmulps_avx512f(auVar83,auVar104);
                            auVar75 = vfmadd213ps_avx512f(auVar82,auVar103,auVar75);
                            auVar75 = vfmadd213ps_avx512f(auVar81,auVar102,auVar75);
                            auVar76 = vrcp14ps_avx512f(auVar73);
                            auVar75 = vaddps_avx512f(auVar75,auVar75);
                            auVar44._8_4_ = 0x3f800000;
                            auVar44._0_8_ = 0x3f8000003f800000;
                            auVar44._12_4_ = 0x3f800000;
                            auVar44._16_4_ = 0x3f800000;
                            auVar44._20_4_ = 0x3f800000;
                            auVar44._24_4_ = 0x3f800000;
                            auVar44._28_4_ = 0x3f800000;
                            auVar44._32_4_ = 0x3f800000;
                            auVar44._36_4_ = 0x3f800000;
                            auVar44._40_4_ = 0x3f800000;
                            auVar44._44_4_ = 0x3f800000;
                            auVar44._48_4_ = 0x3f800000;
                            auVar44._52_4_ = 0x3f800000;
                            auVar44._56_4_ = 0x3f800000;
                            auVar44._60_4_ = 0x3f800000;
                            auVar101 = vfnmadd213ps_avx512f(auVar76,auVar73,auVar44);
                            auVar76 = vfmadd132ps_avx512f(auVar101,auVar76,auVar76);
                            auVar75 = vmulps_avx512f(auVar75,auVar76);
                            uVar23 = vcmpps_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0x200),2);
                            uVar24 = vcmpps_avx512f(auVar75,*(undefined1 (*) [64])(ray + 0xc0),0xd);
                            uVar25 = vcmpps_avx512f(auVar73,auVar72,4);
                            uVar53 = uVar53 & (ushort)uVar23 & (ushort)uVar24 & (ushort)uVar25;
                            if (uVar53 == 0) goto LAB_01f6e96e;
                            local_4c40 = auVar92;
                            local_4c80 = auVar93;
                            local_4cc0 = auVar74;
                            local_4d00 = auVar75;
                            local_4d40 = auVar102;
                            local_4d80 = auVar103;
                            local_4dc0 = auVar104;
                          }
                          pGVar2 = (context->scene->geometries).items
                                   [*(uint *)(local_5358.super_Precalculations.grid + 0x18)].ptr;
                          auVar73 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                          uVar23 = vptestmd_avx512f(auVar73,*(undefined1 (*) [64])(ray + 0x240));
                          uVar53 = (ushort)uVar23 & uVar53;
                          if (uVar53 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar69 = vpbroadcastd_avx512f();
                              auVar73 = vandps_avx512dq(local_4cc0,auVar70);
                              auVar128._8_4_ = 0x219392ef;
                              auVar128._0_8_ = 0x219392ef219392ef;
                              auVar128._12_4_ = 0x219392ef;
                              auVar128._16_4_ = 0x219392ef;
                              auVar128._20_4_ = 0x219392ef;
                              auVar128._24_4_ = 0x219392ef;
                              auVar128._28_4_ = 0x219392ef;
                              auVar128._32_4_ = 0x219392ef;
                              auVar128._36_4_ = 0x219392ef;
                              auVar128._40_4_ = 0x219392ef;
                              auVar128._44_4_ = 0x219392ef;
                              auVar128._48_4_ = 0x219392ef;
                              auVar128._52_4_ = 0x219392ef;
                              auVar128._56_4_ = 0x219392ef;
                              auVar128._60_4_ = 0x219392ef;
                              uVar66 = vcmpps_avx512f(auVar73,auVar128,5);
                              auVar128 = vrcp14ps_avx512f(local_4cc0);
                              auVar73 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                              auVar74 = vfnmadd213ps_avx512f(auVar128,local_4cc0,auVar73);
                              auVar128 = vfmadd132ps_avx512f(auVar74,auVar128,auVar128);
                              auVar109._4_4_ = (uint)((byte)(uVar66 >> 1) & 1) * auVar128._4_4_;
                              auVar109._0_4_ = (uint)((byte)uVar66 & 1) * auVar128._0_4_;
                              auVar109._8_4_ = (uint)((byte)(uVar66 >> 2) & 1) * auVar128._8_4_;
                              auVar109._12_4_ = (uint)((byte)(uVar66 >> 3) & 1) * auVar128._12_4_;
                              auVar109._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar128._16_4_;
                              auVar109._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar128._20_4_;
                              auVar109._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar128._24_4_;
                              auVar109._28_4_ = (uint)((byte)(uVar66 >> 7) & 1) * auVar128._28_4_;
                              auVar109._32_4_ = (uint)((byte)(uVar66 >> 8) & 1) * auVar128._32_4_;
                              auVar109._36_4_ = (uint)((byte)(uVar66 >> 9) & 1) * auVar128._36_4_;
                              auVar109._40_4_ = (uint)((byte)(uVar66 >> 10) & 1) * auVar128._40_4_;
                              auVar109._44_4_ = (uint)((byte)(uVar66 >> 0xb) & 1) * auVar128._44_4_;
                              auVar109._48_4_ = (uint)((byte)(uVar66 >> 0xc) & 1) * auVar128._48_4_;
                              auVar109._52_4_ = (uint)((byte)(uVar66 >> 0xd) & 1) * auVar128._52_4_;
                              auVar109._56_4_ = (uint)((byte)(uVar66 >> 0xe) & 1) * auVar128._56_4_;
                              auVar109._60_4_ = (uint)(byte)(uVar66 >> 0xf) * auVar128._60_4_;
                              auVar128 = vmulps_avx512f(auVar109,local_4c40);
                              auVar128 = vminps_avx512f(auVar128,auVar73);
                              auVar74 = vmulps_avx512f(auVar109,local_4c80);
                              auVar74 = vminps_avx512f(auVar74,auVar73);
                              auVar75 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5338 + lVar55 + 0x2c)));
                              auVar76 = vpsrld_avx512f(auVar75,0x10);
                              auVar101 = vmovdqu16_avx512bw(auVar72);
                              auVar110._2_2_ = auVar101._2_2_;
                              auVar110._0_2_ = auVar75._0_2_;
                              auVar110._4_2_ = auVar75._4_2_;
                              auVar110._6_2_ = auVar101._6_2_;
                              auVar110._8_2_ = auVar75._8_2_;
                              auVar110._10_2_ = auVar101._10_2_;
                              auVar110._12_2_ = auVar75._12_2_;
                              auVar110._14_2_ = auVar101._14_2_;
                              auVar110._16_2_ = auVar75._16_2_;
                              auVar110._18_2_ = auVar101._18_2_;
                              auVar110._20_2_ = auVar75._20_2_;
                              auVar110._22_2_ = auVar101._22_2_;
                              auVar110._24_2_ = auVar75._24_2_;
                              auVar110._26_2_ = auVar101._26_2_;
                              auVar110._28_2_ = auVar75._28_2_;
                              auVar110._30_2_ = auVar101._30_2_;
                              auVar110._32_2_ = auVar75._32_2_;
                              auVar110._34_2_ = auVar101._34_2_;
                              auVar110._36_2_ = auVar75._36_2_;
                              auVar110._38_2_ = auVar101._38_2_;
                              auVar110._40_2_ = auVar75._40_2_;
                              auVar110._42_2_ = auVar101._42_2_;
                              auVar110._44_2_ = auVar75._44_2_;
                              auVar110._46_2_ = auVar101._46_2_;
                              auVar110._48_2_ = auVar75._48_2_;
                              auVar110._50_2_ = auVar101._50_2_;
                              auVar110._52_2_ = auVar75._52_2_;
                              auVar110._54_2_ = auVar101._54_2_;
                              auVar110._56_2_ = auVar75._56_2_;
                              auVar110._58_2_ = auVar101._58_2_;
                              auVar110._62_2_ = auVar101._62_2_;
                              auVar110._60_2_ = auVar75._60_2_;
                              auVar75 = vcvtdq2ps_avx512f(auVar110);
                              auVar101 = vbroadcastss_avx512f(ZEXT416(0x39000000));
                              auVar75 = vmulps_avx512f(auVar75,auVar101);
                              auVar76 = vcvtdq2ps_avx512f(auVar76);
                              auVar76 = vmulps_avx512f(auVar76,auVar101);
                              auVar77 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5340 + lVar55 + 0x30)));
                              auVar78 = vpsrld_avx512f(auVar77,0x10);
                              auVar79 = vmovdqu16_avx512bw(auVar72);
                              auVar111._2_2_ = auVar79._2_2_;
                              auVar111._0_2_ = auVar77._0_2_;
                              auVar111._4_2_ = auVar77._4_2_;
                              auVar111._6_2_ = auVar79._6_2_;
                              auVar111._8_2_ = auVar77._8_2_;
                              auVar111._10_2_ = auVar79._10_2_;
                              auVar111._12_2_ = auVar77._12_2_;
                              auVar111._14_2_ = auVar79._14_2_;
                              auVar111._16_2_ = auVar77._16_2_;
                              auVar111._18_2_ = auVar79._18_2_;
                              auVar111._20_2_ = auVar77._20_2_;
                              auVar111._22_2_ = auVar79._22_2_;
                              auVar111._24_2_ = auVar77._24_2_;
                              auVar111._26_2_ = auVar79._26_2_;
                              auVar111._28_2_ = auVar77._28_2_;
                              auVar111._30_2_ = auVar79._30_2_;
                              auVar111._32_2_ = auVar77._32_2_;
                              auVar111._34_2_ = auVar79._34_2_;
                              auVar111._36_2_ = auVar77._36_2_;
                              auVar111._38_2_ = auVar79._38_2_;
                              auVar111._40_2_ = auVar77._40_2_;
                              auVar111._42_2_ = auVar79._42_2_;
                              auVar111._44_2_ = auVar77._44_2_;
                              auVar111._46_2_ = auVar79._46_2_;
                              auVar111._48_2_ = auVar77._48_2_;
                              auVar111._50_2_ = auVar79._50_2_;
                              auVar111._52_2_ = auVar77._52_2_;
                              auVar111._54_2_ = auVar79._54_2_;
                              auVar111._56_2_ = auVar77._56_2_;
                              auVar111._58_2_ = auVar79._58_2_;
                              auVar111._62_2_ = auVar79._62_2_;
                              auVar111._60_2_ = auVar77._60_2_;
                              auVar77 = vcvtdq2ps_avx512f(auVar111);
                              auVar77 = vmulps_avx512f(auVar77,auVar101);
                              auVar78 = vcvtdq2ps_avx512f(auVar78);
                              auVar78 = vmulps_avx512f(auVar78,auVar101);
                              auVar79 = vpbroadcastd_avx512f
                                                  (ZEXT416(*(uint *)(local_5338 + lVar55 + 0x30)));
                              auVar73 = vsubps_avx512f(auVar73,auVar128);
                              auVar73 = vsubps_avx512f(auVar73,auVar74);
                              auVar75 = vmulps_avx512f(auVar73,auVar75);
                              auVar73 = vmulps_avx512f(auVar73,auVar76);
                              auVar76 = vpsrld_avx512f(auVar79,0x10);
                              auVar80 = vmovdqu16_avx512bw(auVar72);
                              auVar112._2_2_ = auVar80._2_2_;
                              auVar112._0_2_ = auVar79._0_2_;
                              auVar112._4_2_ = auVar79._4_2_;
                              auVar112._6_2_ = auVar80._6_2_;
                              auVar112._8_2_ = auVar79._8_2_;
                              auVar112._10_2_ = auVar80._10_2_;
                              auVar112._12_2_ = auVar79._12_2_;
                              auVar112._14_2_ = auVar80._14_2_;
                              auVar112._16_2_ = auVar79._16_2_;
                              auVar112._18_2_ = auVar80._18_2_;
                              auVar112._20_2_ = auVar79._20_2_;
                              auVar112._22_2_ = auVar80._22_2_;
                              auVar112._24_2_ = auVar79._24_2_;
                              auVar112._26_2_ = auVar80._26_2_;
                              auVar112._28_2_ = auVar79._28_2_;
                              auVar112._30_2_ = auVar80._30_2_;
                              auVar112._32_2_ = auVar79._32_2_;
                              auVar112._34_2_ = auVar80._34_2_;
                              auVar112._36_2_ = auVar79._36_2_;
                              auVar112._38_2_ = auVar80._38_2_;
                              auVar112._40_2_ = auVar79._40_2_;
                              auVar112._42_2_ = auVar80._42_2_;
                              auVar112._44_2_ = auVar79._44_2_;
                              auVar112._46_2_ = auVar80._46_2_;
                              auVar112._48_2_ = auVar79._48_2_;
                              auVar112._50_2_ = auVar80._50_2_;
                              auVar112._52_2_ = auVar79._52_2_;
                              auVar112._54_2_ = auVar80._54_2_;
                              auVar112._56_2_ = auVar79._56_2_;
                              auVar112._58_2_ = auVar80._58_2_;
                              auVar112._62_2_ = auVar80._62_2_;
                              auVar112._60_2_ = auVar79._60_2_;
                              auVar79 = vcvtdq2ps_avx512f(auVar112);
                              auVar79 = vmulps_avx512f(auVar79,auVar101);
                              auVar76 = vcvtdq2ps_avx512f(auVar76);
                              auVar76 = vmulps_avx512f(auVar76,auVar101);
                              auVar75 = vfmadd231ps_avx512f(auVar75,auVar74,auVar79);
                              auVar73 = vfmadd231ps_avx512f(auVar73,auVar74,auVar76);
                              local_4f80 = vfmadd231ps_avx512f(auVar75,auVar128,auVar77);
                              local_4f40 = vfmadd231ps_avx512f(auVar73,auVar128,auVar78);
                              auVar128 = vpbroadcastd_avx512f();
                              pRVar3 = context->user;
                              local_5040 = local_4d40._0_8_;
                              uStack_5038 = local_4d40._8_8_;
                              uStack_5030 = local_4d40._16_8_;
                              uStack_5028 = local_4d40._24_8_;
                              uStack_5020 = local_4d40._32_8_;
                              uStack_5018 = local_4d40._40_8_;
                              uStack_5010 = local_4d40._48_8_;
                              uStack_5008 = local_4d40._56_8_;
                              local_5000 = local_4d80._0_8_;
                              uStack_4ff8 = local_4d80._8_8_;
                              uStack_4ff0 = local_4d80._16_8_;
                              uStack_4fe8 = local_4d80._24_8_;
                              uStack_4fe0 = local_4d80._32_8_;
                              uStack_4fd8 = local_4d80._40_8_;
                              uStack_4fd0 = local_4d80._48_8_;
                              uStack_4fc8 = local_4d80._56_8_;
                              local_4fc0 = local_4dc0._0_8_;
                              uStack_4fb8 = local_4dc0._8_8_;
                              uStack_4fb0 = local_4dc0._16_8_;
                              uStack_4fa8 = local_4dc0._24_8_;
                              uStack_4fa0 = local_4dc0._32_8_;
                              uStack_4f98 = local_4dc0._40_8_;
                              uStack_4f90 = local_4dc0._48_8_;
                              uStack_4f88 = local_4dc0._56_8_;
                              local_4f00 = vmovdqa64_avx512f(auVar128);
                              local_4ec0 = vmovdqa64_avx512f(auVar69);
                              auVar21 = vpcmpeqd_avx2(auVar69._0_32_,auVar69._0_32_);
                              local_5348[3] = auVar21;
                              local_5348[2] = auVar21;
                              local_5348[1] = auVar21;
                              *local_5348 = auVar21;
                              local_4e80 = vbroadcastss_avx512f(ZEXT416(pRVar3->instID[0]));
                              local_4e40 = vbroadcastss_avx512f(ZEXT416(pRVar3->instPrimID[0]));
                              local_5240 = *(undefined1 (*) [64])(ray + 0x200);
                              auVar69 = vblendmps_avx512f(local_5240,local_4d00);
                              bVar49 = (bool)((byte)uVar53 & 1);
                              bVar5 = (bool)((byte)(uVar53 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar53 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar53 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar53 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar53 >> 7) & 1);
                              bVar12 = (byte)(uVar53 >> 8);
                              bVar13 = (bool)(bVar12 >> 1 & 1);
                              bVar14 = (bool)(bVar12 >> 2 & 1);
                              bVar15 = (bool)(bVar12 >> 3 & 1);
                              bVar16 = (bool)(bVar12 >> 4 & 1);
                              bVar17 = (bool)(bVar12 >> 5 & 1);
                              bVar18 = (bool)(bVar12 >> 6 & 1);
                              *(uint *)(ray + 0x200) =
                                   (uint)bVar49 * auVar69._0_4_ | (uint)!bVar49 * local_4e40._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar5 * auVar69._4_4_ | (uint)!bVar5 * local_4e40._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar6 * auVar69._8_4_ | (uint)!bVar6 * local_4e40._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar7 * auVar69._12_4_ | (uint)!bVar7 * local_4e40._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar8 * auVar69._16_4_ | (uint)!bVar8 * local_4e40._16_4_;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar9 * auVar69._20_4_ | (uint)!bVar9 * local_4e40._20_4_;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar10 * auVar69._24_4_ | (uint)!bVar10 * local_4e40._24_4_
                              ;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar11 * auVar69._28_4_ | (uint)!bVar11 * local_4e40._28_4_
                              ;
                              *(uint *)(ray + 0x220) =
                                   (uint)(bVar12 & 1) * auVar69._32_4_ |
                                   (uint)!(bool)(bVar12 & 1) * local_4e40._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar13 * auVar69._36_4_ | (uint)!bVar13 * local_4e40._36_4_
                              ;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar14 * auVar69._40_4_ | (uint)!bVar14 * local_4e40._40_4_
                              ;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar15 * auVar69._44_4_ | (uint)!bVar15 * local_4e40._44_4_
                              ;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar16 * auVar69._48_4_ | (uint)!bVar16 * local_4e40._48_4_
                              ;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar17 * auVar69._52_4_ | (uint)!bVar17 * local_4e40._52_4_
                              ;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar18 * auVar69._56_4_ | (uint)!bVar18 * local_4e40._56_4_
                              ;
                              *(uint *)(ray + 0x23c) =
                                   (uint)(bVar12 >> 7) * auVar69._60_4_ |
                                   (uint)!(bool)(bVar12 >> 7) * local_4e40._60_4_;
                              auVar73 = vpmovm2d_avx512dq((ulong)uVar53);
                              local_5200 = vmovdqa64_avx512f(auVar73);
                              local_5330.valid = (int *)local_5200;
                              local_5330.geometryUserPtr = pGVar2->userPtr;
                              local_5330.context = context->user;
                              local_5330.hit = (RTCHitN *)&local_5040;
                              local_5330.N = 0x10;
                              local_5330.ray = (RTCRayN *)ray;
                              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar2->occlusionFilterN)(&local_5330);
                                auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                auVar72 = ZEXT1664(auVar68);
                                auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                auVar73 = vmovdqa64_avx512f(local_5200);
                              }
                              auVar68 = auVar72._0_16_;
                              uVar23 = vptestmd_avx512f(auVar73,auVar73);
                              if ((short)uVar23 == 0) {
                                uVar66 = 0;
                                auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                              }
                              else {
                                p_Var4 = context->args->filter;
                                if (p_Var4 == (RTCFilterFunctionN)0x0) {
                                  auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                }
                                else {
                                  auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                  auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                  if (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                     (((pGVar2->field_8).field_0x2 & 0x40) != 0)) {
                                    (*p_Var4)(&local_5330);
                                    auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                                    auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                                    auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                    auVar72 = ZEXT1664(auVar68);
                                    auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                                    auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                                    auVar73 = vmovdqa64_avx512f(local_5200);
                                  }
                                }
                                uVar66 = vptestmd_avx512f(auVar73,auVar73);
                                auVar73 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar49 = (bool)((byte)uVar66 & 1);
                                bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                                bVar6 = (bool)((byte)(uVar66 >> 2) & 1);
                                bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
                                bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                                bVar9 = (bool)((byte)(uVar66 >> 5) & 1);
                                bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
                                bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                                bVar13 = (bool)((byte)(uVar66 >> 8) & 1);
                                bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
                                bVar15 = (bool)((byte)(uVar66 >> 10) & 1);
                                bVar16 = (bool)((byte)(uVar66 >> 0xb) & 1);
                                bVar17 = (bool)((byte)(uVar66 >> 0xc) & 1);
                                bVar18 = (bool)((byte)(uVar66 >> 0xd) & 1);
                                bVar19 = (bool)((byte)(uVar66 >> 0xe) & 1);
                                bVar20 = SUB81(uVar66 >> 0xf,0);
                                *(uint *)(local_5330.ray + 0x200) =
                                     (uint)bVar49 * auVar73._0_4_ |
                                     (uint)!bVar49 * *(int *)(local_5330.ray + 0x200);
                                *(uint *)(local_5330.ray + 0x204) =
                                     (uint)bVar5 * auVar73._4_4_ |
                                     (uint)!bVar5 * *(int *)(local_5330.ray + 0x204);
                                *(uint *)(local_5330.ray + 0x208) =
                                     (uint)bVar6 * auVar73._8_4_ |
                                     (uint)!bVar6 * *(int *)(local_5330.ray + 0x208);
                                *(uint *)(local_5330.ray + 0x20c) =
                                     (uint)bVar7 * auVar73._12_4_ |
                                     (uint)!bVar7 * *(int *)(local_5330.ray + 0x20c);
                                *(uint *)(local_5330.ray + 0x210) =
                                     (uint)bVar8 * auVar73._16_4_ |
                                     (uint)!bVar8 * *(int *)(local_5330.ray + 0x210);
                                *(uint *)(local_5330.ray + 0x214) =
                                     (uint)bVar9 * auVar73._20_4_ |
                                     (uint)!bVar9 * *(int *)(local_5330.ray + 0x214);
                                *(uint *)(local_5330.ray + 0x218) =
                                     (uint)bVar10 * auVar73._24_4_ |
                                     (uint)!bVar10 * *(int *)(local_5330.ray + 0x218);
                                *(uint *)(local_5330.ray + 0x21c) =
                                     (uint)bVar11 * auVar73._28_4_ |
                                     (uint)!bVar11 * *(int *)(local_5330.ray + 0x21c);
                                *(uint *)(local_5330.ray + 0x220) =
                                     (uint)bVar13 * auVar73._32_4_ |
                                     (uint)!bVar13 * *(int *)(local_5330.ray + 0x220);
                                *(uint *)(local_5330.ray + 0x224) =
                                     (uint)bVar14 * auVar73._36_4_ |
                                     (uint)!bVar14 * *(int *)(local_5330.ray + 0x224);
                                *(uint *)(local_5330.ray + 0x228) =
                                     (uint)bVar15 * auVar73._40_4_ |
                                     (uint)!bVar15 * *(int *)(local_5330.ray + 0x228);
                                *(uint *)(local_5330.ray + 0x22c) =
                                     (uint)bVar16 * auVar73._44_4_ |
                                     (uint)!bVar16 * *(int *)(local_5330.ray + 0x22c);
                                *(uint *)(local_5330.ray + 0x230) =
                                     (uint)bVar17 * auVar73._48_4_ |
                                     (uint)!bVar17 * *(int *)(local_5330.ray + 0x230);
                                *(uint *)(local_5330.ray + 0x234) =
                                     (uint)bVar18 * auVar73._52_4_ |
                                     (uint)!bVar18 * *(int *)(local_5330.ray + 0x234);
                                *(uint *)(local_5330.ray + 0x238) =
                                     (uint)bVar19 * auVar73._56_4_ |
                                     (uint)!bVar19 * *(int *)(local_5330.ray + 0x238);
                                *(uint *)(local_5330.ray + 0x23c) =
                                     (uint)bVar20 * auVar73._60_4_ |
                                     (uint)!bVar20 * *(int *)(local_5330.ray + 0x23c);
                              }
                              uVar53 = (ushort)uVar66;
                              bVar49 = (bool)((byte)uVar66 & 1);
                              bVar5 = (bool)((byte)(uVar66 >> 1) & 1);
                              bVar6 = (bool)((byte)(uVar66 >> 2) & 1);
                              bVar7 = (bool)((byte)(uVar66 >> 3) & 1);
                              bVar8 = (bool)((byte)(uVar66 >> 4) & 1);
                              bVar9 = (bool)((byte)(uVar66 >> 5) & 1);
                              bVar10 = (bool)((byte)(uVar66 >> 6) & 1);
                              bVar11 = (bool)((byte)(uVar66 >> 7) & 1);
                              bVar13 = (bool)((byte)(uVar66 >> 8) & 1);
                              bVar14 = (bool)((byte)(uVar66 >> 9) & 1);
                              bVar15 = (bool)((byte)(uVar66 >> 10) & 1);
                              bVar16 = (bool)((byte)(uVar66 >> 0xb) & 1);
                              bVar17 = (bool)((byte)(uVar66 >> 0xc) & 1);
                              bVar18 = (bool)((byte)(uVar66 >> 0xd) & 1);
                              bVar19 = (bool)((byte)(uVar66 >> 0xe) & 1);
                              bVar20 = SUB81(uVar66 >> 0xf,0);
                              *(uint *)pRVar1 =
                                   (uint)bVar49 * *(int *)pRVar1 | (uint)!bVar49 * local_5240._0_4_;
                              *(uint *)(ray + 0x204) =
                                   (uint)bVar5 * *(int *)(ray + 0x204) |
                                   (uint)!bVar5 * local_5240._4_4_;
                              *(uint *)(ray + 0x208) =
                                   (uint)bVar6 * *(int *)(ray + 0x208) |
                                   (uint)!bVar6 * local_5240._8_4_;
                              *(uint *)(ray + 0x20c) =
                                   (uint)bVar7 * *(int *)(ray + 0x20c) |
                                   (uint)!bVar7 * local_5240._12_4_;
                              *(uint *)(ray + 0x210) =
                                   (uint)bVar8 * *(int *)(ray + 0x210) |
                                   (uint)!bVar8 * local_5240._16_4_;
                              *(uint *)(ray + 0x214) =
                                   (uint)bVar9 * *(int *)(ray + 0x214) |
                                   (uint)!bVar9 * local_5240._20_4_;
                              *(uint *)(ray + 0x218) =
                                   (uint)bVar10 * *(int *)(ray + 0x218) |
                                   (uint)!bVar10 * local_5240._24_4_;
                              *(uint *)(ray + 0x21c) =
                                   (uint)bVar11 * *(int *)(ray + 0x21c) |
                                   (uint)!bVar11 * local_5240._28_4_;
                              *(uint *)(ray + 0x220) =
                                   (uint)bVar13 * *(int *)(ray + 0x220) |
                                   (uint)!bVar13 * local_5240._32_4_;
                              *(uint *)(ray + 0x224) =
                                   (uint)bVar14 * *(int *)(ray + 0x224) |
                                   (uint)!bVar14 * local_5240._36_4_;
                              *(uint *)(ray + 0x228) =
                                   (uint)bVar15 * *(int *)(ray + 0x228) |
                                   (uint)!bVar15 * local_5240._40_4_;
                              *(uint *)(ray + 0x22c) =
                                   (uint)bVar16 * *(int *)(ray + 0x22c) |
                                   (uint)!bVar16 * local_5240._44_4_;
                              *(uint *)(ray + 0x230) =
                                   (uint)bVar17 * *(int *)(ray + 0x230) |
                                   (uint)!bVar17 * local_5240._48_4_;
                              *(uint *)(ray + 0x234) =
                                   (uint)bVar18 * *(int *)(ray + 0x234) |
                                   (uint)!bVar18 * local_5240._52_4_;
                              *(uint *)(ray + 0x238) =
                                   (uint)bVar19 * *(int *)(ray + 0x238) |
                                   (uint)!bVar19 * local_5240._56_4_;
                              *(uint *)(ray + 0x23c) =
                                   (uint)bVar20 * *(int *)(ray + 0x23c) |
                                   (uint)!bVar20 * local_5240._60_4_;
                            }
                            uVar50 = uVar50 & (ushort)~uVar53;
                          }
                          lVar55 = lVar55 + 4;
                        } while ((short)uVar50 != 0);
                        uVar50 = 0;
LAB_01f6ed50:
                        lVar54 = 1;
                        bVar49 = (bool)(bVar48 & iVar67 != 2);
                        bVar48 = 0;
                      } while (bVar49);
                      local_53a4 = local_53a4 & (uVar50 | uVar51);
                      uVar53 = (ushort)local_539c & (ushort)uVar51;
                      local_539c = CONCAT22((short)(local_539c >> 0x10),uVar53);
                    } while (uVar53 != 0);
                    local_53a4 = ~local_53a4;
                  }
                  uVar52 = 0;
                }
                else {
                  local_5358.super_Precalculations.grid =
                       *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  uVar52 = *(ulong *)local_5358.super_Precalculations.grid;
                  local_53a4 = 0;
                }
                uVar63 = local_53a4 | uVar63;
                if ((short)uVar63 == -1) {
                  uVar63 = 0xffff;
                  goto LAB_01f6ef21;
                }
                auVar73 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar49 = (bool)((byte)uVar63 & 1);
                bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
                bVar11 = (bool)((byte)(uVar63 >> 7) & 1);
                bVar13 = (bool)((byte)(uVar63 >> 8) & 1);
                bVar14 = (bool)((byte)(uVar63 >> 9) & 1);
                bVar15 = (bool)((byte)(uVar63 >> 10) & 1);
                bVar16 = (bool)((byte)(uVar63 >> 0xb) & 1);
                bVar17 = (bool)((byte)(uVar63 >> 0xc) & 1);
                bVar18 = (bool)((byte)(uVar63 >> 0xd) & 1);
                bVar19 = (bool)((byte)(uVar63 >> 0xe) & 1);
                bVar20 = (bool)((byte)(uVar63 >> 0xf) & 1);
                local_44c0 = (uint)bVar49 * auVar73._0_4_ | !bVar49 * local_44c0;
                uStack_44bc = (uint)bVar5 * auVar73._4_4_ | !bVar5 * uStack_44bc;
                uStack_44b8 = (uint)bVar6 * auVar73._8_4_ | !bVar6 * uStack_44b8;
                uStack_44b4 = (uint)bVar7 * auVar73._12_4_ | !bVar7 * uStack_44b4;
                uStack_44b0 = (uint)bVar8 * auVar73._16_4_ | !bVar8 * uStack_44b0;
                uStack_44ac = (uint)bVar9 * auVar73._20_4_ | !bVar9 * uStack_44ac;
                uStack_44a8 = (uint)bVar10 * auVar73._24_4_ | !bVar10 * uStack_44a8;
                uStack_44a4 = (uint)bVar11 * auVar73._28_4_ | !bVar11 * uStack_44a4;
                uStack_44a0 = (uint)bVar13 * auVar73._32_4_ | !bVar13 * uStack_44a0;
                uStack_449c = (uint)bVar14 * auVar73._36_4_ | !bVar14 * uStack_449c;
                uStack_4498 = (uint)bVar15 * auVar73._40_4_ | !bVar15 * uStack_4498;
                uStack_4494 = (uint)bVar16 * auVar73._44_4_ | !bVar16 * uStack_4494;
                uStack_4490 = (uint)bVar17 * auVar73._48_4_ | !bVar17 * uStack_4490;
                uStack_448c = (uint)bVar18 * auVar73._52_4_ | !bVar18 * uStack_448c;
                uStack_4488 = (uint)bVar19 * auVar73._56_4_ | !bVar19 * uStack_4488;
                uStack_4484 = (uint)bVar20 * auVar73._60_4_ | !bVar20 * uStack_4484;
                if (uVar52 != 0) {
                  *puVar60 = uVar52;
                  puVar60 = puVar60 + 1;
                  auVar73 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                  *pauVar59 = auVar73;
                  pauVar59 = pauVar59 + 1;
                }
              }
              goto LAB_01f6d7c8;
            }
            auVar101._4_4_ = uStack_44bc;
            auVar101._0_4_ = local_44c0;
            auVar101._8_4_ = uStack_44b8;
            auVar101._12_4_ = uStack_44b4;
            auVar101._16_4_ = uStack_44b0;
            auVar101._20_4_ = uStack_44ac;
            auVar101._24_4_ = uStack_44a8;
            auVar101._28_4_ = uStack_44a4;
            auVar101._32_4_ = uStack_44a0;
            auVar101._36_4_ = uStack_449c;
            auVar101._40_4_ = uStack_4498;
            auVar101._44_4_ = uStack_4494;
            auVar101._48_4_ = uStack_4490;
            auVar101._52_4_ = uStack_448c;
            auVar101._56_4_ = uStack_4488;
            auVar101._60_4_ = uStack_4484;
            uVar52 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar54 = -0x10;
            auVar73 = auVar71;
            do {
              uVar66 = *(ulong *)(uVar52 + 0x20 + lVar54 * 2);
              if (uVar66 == 8) break;
              auVar75 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0x90 + lVar54)));
              auVar74 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar61 = *(undefined4 *)(uVar52 + 0x30 + lVar54);
              auVar77._4_4_ = uVar61;
              auVar77._0_4_ = uVar61;
              auVar77._8_4_ = uVar61;
              auVar77._12_4_ = uVar61;
              auVar77._16_4_ = uVar61;
              auVar77._20_4_ = uVar61;
              auVar77._24_4_ = uVar61;
              auVar77._28_4_ = uVar61;
              auVar77._32_4_ = uVar61;
              auVar77._36_4_ = uVar61;
              auVar77._40_4_ = uVar61;
              auVar77._44_4_ = uVar61;
              auVar77._48_4_ = uVar61;
              auVar77._52_4_ = uVar61;
              auVar77._56_4_ = uVar61;
              auVar77._60_4_ = uVar61;
              auVar75 = vfmadd213ps_avx512f(auVar75,auVar74,auVar77);
              auVar76 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0xb0 + lVar54)));
              uVar61 = *(undefined4 *)(uVar52 + 0x50 + lVar54);
              auVar78._4_4_ = uVar61;
              auVar78._0_4_ = uVar61;
              auVar78._8_4_ = uVar61;
              auVar78._12_4_ = uVar61;
              auVar78._16_4_ = uVar61;
              auVar78._20_4_ = uVar61;
              auVar78._24_4_ = uVar61;
              auVar78._28_4_ = uVar61;
              auVar78._32_4_ = uVar61;
              auVar78._36_4_ = uVar61;
              auVar78._40_4_ = uVar61;
              auVar78._44_4_ = uVar61;
              auVar78._48_4_ = uVar61;
              auVar78._52_4_ = uVar61;
              auVar78._56_4_ = uVar61;
              auVar78._60_4_ = uVar61;
              auVar76 = vfmadd213ps_avx512f(auVar76,auVar74,auVar78);
              auVar77 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0xd0 + lVar54)));
              uVar61 = *(undefined4 *)(uVar52 + 0x70 + lVar54);
              auVar79._4_4_ = uVar61;
              auVar79._0_4_ = uVar61;
              auVar79._8_4_ = uVar61;
              auVar79._12_4_ = uVar61;
              auVar79._16_4_ = uVar61;
              auVar79._20_4_ = uVar61;
              auVar79._24_4_ = uVar61;
              auVar79._28_4_ = uVar61;
              auVar79._32_4_ = uVar61;
              auVar79._36_4_ = uVar61;
              auVar79._40_4_ = uVar61;
              auVar79._44_4_ = uVar61;
              auVar79._48_4_ = uVar61;
              auVar79._52_4_ = uVar61;
              auVar79._56_4_ = uVar61;
              auVar79._60_4_ = uVar61;
              auVar77 = vfmadd213ps_avx512f(auVar77,auVar74,auVar79);
              auVar78 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0xa0 + lVar54)));
              uVar61 = *(undefined4 *)(uVar52 + 0x40 + lVar54);
              auVar80._4_4_ = uVar61;
              auVar80._0_4_ = uVar61;
              auVar80._8_4_ = uVar61;
              auVar80._12_4_ = uVar61;
              auVar80._16_4_ = uVar61;
              auVar80._20_4_ = uVar61;
              auVar80._24_4_ = uVar61;
              auVar80._28_4_ = uVar61;
              auVar80._32_4_ = uVar61;
              auVar80._36_4_ = uVar61;
              auVar80._40_4_ = uVar61;
              auVar80._44_4_ = uVar61;
              auVar80._48_4_ = uVar61;
              auVar80._52_4_ = uVar61;
              auVar80._56_4_ = uVar61;
              auVar80._60_4_ = uVar61;
              auVar78 = vfmadd213ps_avx512f(auVar78,auVar74,auVar80);
              auVar79 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0xc0 + lVar54)));
              uVar61 = *(undefined4 *)(uVar52 + 0x60 + lVar54);
              auVar81._4_4_ = uVar61;
              auVar81._0_4_ = uVar61;
              auVar81._8_4_ = uVar61;
              auVar81._12_4_ = uVar61;
              auVar81._16_4_ = uVar61;
              auVar81._20_4_ = uVar61;
              auVar81._24_4_ = uVar61;
              auVar81._28_4_ = uVar61;
              auVar81._32_4_ = uVar61;
              auVar81._36_4_ = uVar61;
              auVar81._40_4_ = uVar61;
              auVar81._44_4_ = uVar61;
              auVar81._48_4_ = uVar61;
              auVar81._52_4_ = uVar61;
              auVar81._56_4_ = uVar61;
              auVar81._60_4_ = uVar61;
              auVar79 = vfmadd213ps_avx512f(auVar79,auVar74,auVar81);
              auVar80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar52 + 0xe0 + lVar54)));
              uVar61 = *(undefined4 *)(uVar52 + 0x80 + lVar54);
              auVar82._4_4_ = uVar61;
              auVar82._0_4_ = uVar61;
              auVar82._8_4_ = uVar61;
              auVar82._12_4_ = uVar61;
              auVar82._16_4_ = uVar61;
              auVar82._20_4_ = uVar61;
              auVar82._24_4_ = uVar61;
              auVar82._28_4_ = uVar61;
              auVar82._32_4_ = uVar61;
              auVar82._36_4_ = uVar61;
              auVar82._40_4_ = uVar61;
              auVar82._44_4_ = uVar61;
              auVar82._48_4_ = uVar61;
              auVar82._52_4_ = uVar61;
              auVar82._56_4_ = uVar61;
              auVar82._60_4_ = uVar61;
              auVar80 = vfmadd213ps_avx512f(auVar80,auVar74,auVar82);
              auVar75 = vfmsub213ps_avx512f(auVar75,local_4740,local_4680);
              auVar76 = vfmsub213ps_avx512f(auVar76,local_4700,local_4640);
              auVar77 = vfmsub213ps_avx512f(auVar77,local_46c0,local_4600);
              auVar78 = vfmsub213ps_avx512f(auVar78,local_4740,local_4680);
              auVar79 = vfmsub213ps_avx512f(auVar79,local_4700,local_4640);
              auVar80 = vfmsub213ps_avx512f(auVar80,local_46c0,local_4600);
              auVar81 = vpminsd_avx512f(auVar75,auVar78);
              auVar82 = vpminsd_avx512f(auVar76,auVar79);
              auVar81 = vpmaxsd_avx512f(auVar81,auVar82);
              auVar82 = vpminsd_avx512f(auVar77,auVar80);
              auVar81 = vpmaxsd_avx512f(auVar81,auVar82);
              auVar75 = vpmaxsd_avx512f(auVar75,auVar78);
              auVar76 = vpmaxsd_avx512f(auVar76,auVar79);
              auVar75 = vpminsd_avx512f(auVar75,auVar76);
              auVar76 = vpmaxsd_avx512f(auVar77,auVar80);
              auVar75 = vpminsd_avx512f(auVar75,auVar76);
              auVar83._4_4_ = uStack_44fc;
              auVar83._0_4_ = local_4500;
              auVar83._8_4_ = uStack_44f8;
              auVar83._12_4_ = uStack_44f4;
              auVar83._16_4_ = uStack_44f0;
              auVar83._20_4_ = uStack_44ec;
              auVar83._24_4_ = uStack_44e8;
              auVar83._28_4_ = uStack_44e4;
              auVar83._32_4_ = uStack_44e0;
              auVar83._36_4_ = uStack_44dc;
              auVar83._40_4_ = uStack_44d8;
              auVar83._44_4_ = uStack_44d4;
              auVar83._48_4_ = uStack_44d0;
              auVar83._52_4_ = uStack_44cc;
              auVar83._56_4_ = uStack_44c8;
              auVar83._60_4_ = uStack_44c4;
              auVar76 = vpmaxsd_avx512f(auVar81,auVar83);
              auVar84._4_4_ = uStack_44bc;
              auVar84._0_4_ = local_44c0;
              auVar84._8_4_ = uStack_44b8;
              auVar84._12_4_ = uStack_44b4;
              auVar84._16_4_ = uStack_44b0;
              auVar84._20_4_ = uStack_44ac;
              auVar84._24_4_ = uStack_44a8;
              auVar84._28_4_ = uStack_44a4;
              auVar84._32_4_ = uStack_44a0;
              auVar84._36_4_ = uStack_449c;
              auVar84._40_4_ = uStack_4498;
              auVar84._44_4_ = uStack_4494;
              auVar84._48_4_ = uStack_4490;
              auVar84._52_4_ = uStack_448c;
              auVar84._56_4_ = uStack_4488;
              auVar84._60_4_ = uStack_4484;
              auVar75 = vpminsd_avx512f(auVar75,auVar84);
              uVar65 = vcmpps_avx512f(auVar76,auVar75,2);
              if ((uVar51 & 7) == 6) {
                uVar61 = *(undefined4 *)(uVar52 + 0xf0 + lVar54);
                auVar85._4_4_ = uVar61;
                auVar85._0_4_ = uVar61;
                auVar85._8_4_ = uVar61;
                auVar85._12_4_ = uVar61;
                auVar85._16_4_ = uVar61;
                auVar85._20_4_ = uVar61;
                auVar85._24_4_ = uVar61;
                auVar85._28_4_ = uVar61;
                auVar85._32_4_ = uVar61;
                auVar85._36_4_ = uVar61;
                auVar85._40_4_ = uVar61;
                auVar85._44_4_ = uVar61;
                auVar85._48_4_ = uVar61;
                auVar85._52_4_ = uVar61;
                auVar85._56_4_ = uVar61;
                auVar85._60_4_ = uVar61;
                uVar57 = vcmpps_avx512f(auVar74,auVar85,0xd);
                uVar61 = *(undefined4 *)(uVar52 + 0x100 + lVar54);
                auVar86._4_4_ = uVar61;
                auVar86._0_4_ = uVar61;
                auVar86._8_4_ = uVar61;
                auVar86._12_4_ = uVar61;
                auVar86._16_4_ = uVar61;
                auVar86._20_4_ = uVar61;
                auVar86._24_4_ = uVar61;
                auVar86._28_4_ = uVar61;
                auVar86._32_4_ = uVar61;
                auVar86._36_4_ = uVar61;
                auVar86._40_4_ = uVar61;
                auVar86._44_4_ = uVar61;
                auVar86._48_4_ = uVar61;
                auVar86._52_4_ = uVar61;
                auVar86._56_4_ = uVar61;
                auVar86._60_4_ = uVar61;
                uVar22 = vcmpps_avx512f(auVar74,auVar86,1);
                uVar65 = uVar65 & uVar57 & uVar22;
              }
              uVar57 = vcmpps_avx512f(auVar101,local_51c0,6);
              uVar65 = uVar65 & uVar57;
              uVar57 = root.ptr;
              auVar87 = auVar73;
              if ((short)uVar65 != 0) {
                auVar75 = vblendmps_avx512f(auVar71,auVar81);
                bVar49 = (bool)((byte)uVar65 & 1);
                auVar87._0_4_ = (uint)bVar49 * auVar75._0_4_ | (uint)!bVar49 * auVar74._0_4_;
                bVar49 = (bool)((byte)(uVar65 >> 1) & 1);
                auVar87._4_4_ = (uint)bVar49 * auVar75._4_4_ | (uint)!bVar49 * auVar74._4_4_;
                bVar49 = (bool)((byte)(uVar65 >> 2) & 1);
                auVar87._8_4_ = (uint)bVar49 * auVar75._8_4_ | (uint)!bVar49 * auVar74._8_4_;
                bVar49 = (bool)((byte)(uVar65 >> 3) & 1);
                auVar87._12_4_ = (uint)bVar49 * auVar75._12_4_ | (uint)!bVar49 * auVar74._12_4_;
                bVar49 = (bool)((byte)(uVar65 >> 4) & 1);
                auVar87._16_4_ = (uint)bVar49 * auVar75._16_4_ | (uint)!bVar49 * auVar74._16_4_;
                bVar49 = (bool)((byte)(uVar65 >> 5) & 1);
                auVar87._20_4_ = (uint)bVar49 * auVar75._20_4_ | (uint)!bVar49 * auVar74._20_4_;
                bVar49 = (bool)((byte)(uVar65 >> 6) & 1);
                auVar87._24_4_ = (uint)bVar49 * auVar75._24_4_ | (uint)!bVar49 * auVar74._24_4_;
                bVar49 = (bool)((byte)(uVar65 >> 7) & 1);
                auVar87._28_4_ = (uint)bVar49 * auVar75._28_4_ | (uint)!bVar49 * auVar74._28_4_;
                bVar49 = (bool)((byte)(uVar65 >> 8) & 1);
                auVar87._32_4_ = (uint)bVar49 * auVar75._32_4_ | (uint)!bVar49 * auVar74._32_4_;
                bVar49 = (bool)((byte)(uVar65 >> 9) & 1);
                auVar87._36_4_ = (uint)bVar49 * auVar75._36_4_ | (uint)!bVar49 * auVar74._36_4_;
                bVar49 = (bool)((byte)(uVar65 >> 10) & 1);
                auVar87._40_4_ = (uint)bVar49 * auVar75._40_4_ | (uint)!bVar49 * auVar74._40_4_;
                bVar49 = (bool)((byte)(uVar65 >> 0xb) & 1);
                auVar87._44_4_ = (uint)bVar49 * auVar75._44_4_ | (uint)!bVar49 * auVar74._44_4_;
                bVar49 = (bool)((byte)(uVar65 >> 0xc) & 1);
                auVar87._48_4_ = (uint)bVar49 * auVar75._48_4_ | (uint)!bVar49 * auVar74._48_4_;
                bVar49 = (bool)((byte)(uVar65 >> 0xd) & 1);
                auVar87._52_4_ = (uint)bVar49 * auVar75._52_4_ | (uint)!bVar49 * auVar74._52_4_;
                bVar49 = (bool)((byte)(uVar65 >> 0xe) & 1);
                auVar87._56_4_ = (uint)bVar49 * auVar75._56_4_ | (uint)!bVar49 * auVar74._56_4_;
                bVar49 = SUB81(uVar65 >> 0xf,0);
                auVar87._60_4_ = (uint)bVar49 * auVar75._60_4_ | (uint)!bVar49 * auVar74._60_4_;
                uVar57 = uVar66;
                if (root.ptr != 8) {
                  *puVar60 = root.ptr;
                  puVar60 = puVar60 + 1;
                  *pauVar59 = auVar73;
                  pauVar59 = pauVar59 + 1;
                }
              }
              auVar73 = auVar87;
              root.ptr = uVar57;
              lVar54 = lVar54 + 4;
            } while (lVar54 != 0);
            iVar67 = 4;
            if (root.ptr == 8) goto LAB_01f6da0d;
            auVar88._4_4_ = uStack_44bc;
            auVar88._0_4_ = local_44c0;
            auVar88._8_4_ = uStack_44b8;
            auVar88._12_4_ = uStack_44b4;
            auVar88._16_4_ = uStack_44b0;
            auVar88._20_4_ = uStack_44ac;
            auVar88._24_4_ = uStack_44a8;
            auVar88._28_4_ = uStack_44a4;
            auVar88._32_4_ = uStack_44a0;
            auVar88._36_4_ = uStack_449c;
            auVar88._40_4_ = uStack_4498;
            auVar88._44_4_ = uStack_4494;
            auVar88._48_4_ = uStack_4490;
            auVar88._52_4_ = uStack_448c;
            auVar88._56_4_ = uStack_4488;
            auVar88._60_4_ = uStack_4484;
            uVar23 = vcmpps_avx512f(auVar73,auVar88,9);
            local_51c0 = auVar73;
          } while ((ushort)uVar56 < (ushort)POPCOUNT((int)uVar23));
          *puVar60 = root.ptr;
          puVar60 = puVar60 + 1;
          *pauVar59 = auVar73;
          pauVar59 = pauVar59 + 1;
        }
        else {
          do {
            k = 0;
            for (uVar66 = uVar52; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            local_5240._0_8_ = k;
            bVar49 = occluded1(local_52f8,local_5300,root,k,&local_5358,ray,
                               (TravRayK<16,_false> *)&local_48c0.field_0,context);
            uVar51 = 1 << (local_5240._0_4_ & 0x1f);
            if (!bVar49) {
              uVar51 = 0;
            }
            uVar63 = uVar63 | uVar51;
            uVar52 = uVar52 - 1 & uVar52;
          } while (uVar52 != 0);
          if ((short)uVar63 == -1) {
            iVar67 = 3;
          }
          else {
            auVar69 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar49 = (bool)((byte)uVar63 & 1);
            bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
            bVar11 = (bool)((byte)(uVar63 >> 7) & 1);
            bVar13 = (bool)((byte)(uVar63 >> 8) & 1);
            bVar14 = (bool)((byte)(uVar63 >> 9) & 1);
            bVar15 = (bool)((byte)(uVar63 >> 10) & 1);
            bVar16 = (bool)((byte)(uVar63 >> 0xb) & 1);
            bVar17 = (bool)((byte)(uVar63 >> 0xc) & 1);
            bVar18 = (bool)((byte)(uVar63 >> 0xd) & 1);
            bVar19 = (bool)((byte)(uVar63 >> 0xe) & 1);
            bVar20 = (bool)((byte)(uVar63 >> 0xf) & 1);
            local_44c0 = (uint)bVar49 * auVar69._0_4_ | !bVar49 * local_44c0;
            uStack_44bc = (uint)bVar5 * auVar69._4_4_ | !bVar5 * uStack_44bc;
            uStack_44b8 = (uint)bVar6 * auVar69._8_4_ | !bVar6 * uStack_44b8;
            uStack_44b4 = (uint)bVar7 * auVar69._12_4_ | !bVar7 * uStack_44b4;
            uStack_44b0 = (uint)bVar8 * auVar69._16_4_ | !bVar8 * uStack_44b0;
            uStack_44ac = (uint)bVar9 * auVar69._20_4_ | !bVar9 * uStack_44ac;
            uStack_44a8 = (uint)bVar10 * auVar69._24_4_ | !bVar10 * uStack_44a8;
            uStack_44a4 = (uint)bVar11 * auVar69._28_4_ | !bVar11 * uStack_44a4;
            uStack_44a0 = (uint)bVar13 * auVar69._32_4_ | !bVar13 * uStack_44a0;
            uStack_449c = (uint)bVar14 * auVar69._36_4_ | !bVar14 * uStack_449c;
            uStack_4498 = (uint)bVar15 * auVar69._40_4_ | !bVar15 * uStack_4498;
            uStack_4494 = (uint)bVar16 * auVar69._44_4_ | !bVar16 * uStack_4494;
            uStack_4490 = (uint)bVar17 * auVar69._48_4_ | !bVar17 * uStack_4490;
            uStack_448c = (uint)bVar18 * auVar69._52_4_ | !bVar18 * uStack_448c;
            uStack_4488 = (uint)bVar19 * auVar69._56_4_ | !bVar19 * uStack_4488;
            uStack_4484 = (uint)bVar20 * auVar69._60_4_ | !bVar20 * uStack_4484;
            iVar67 = 2;
          }
          auVar71 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
          auVar70 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
          auVar68 = vxorps_avx512vl(auVar72._0_16_,auVar72._0_16_);
          auVar72 = ZEXT1664(auVar68);
          auVar128 = vbroadcastss_avx512f(ZEXT416(0x34000000));
          auVar69 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          if (uVar56 < (uint)POPCOUNT(uVar61)) goto LAB_01f6d811;
        }
LAB_01f6da0d:
      } while ((iVar67 == 4) || (iVar67 == 2));
LAB_01f6ef21:
      uVar63 = uVar63 & (uint)uVar64;
      auVar69 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar49 = (bool)((byte)uVar63 & 1);
      bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar63 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar63 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar63 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar63 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar63 >> 7) & 1);
      bVar13 = (bool)((byte)(uVar63 >> 8) & 1);
      bVar14 = (bool)((byte)(uVar63 >> 9) & 1);
      bVar15 = (bool)((byte)(uVar63 >> 10) & 1);
      bVar16 = (bool)((byte)(uVar63 >> 0xb) & 1);
      bVar17 = (bool)((byte)(uVar63 >> 0xc) & 1);
      bVar18 = (bool)((byte)(uVar63 >> 0xd) & 1);
      bVar19 = (bool)((byte)(uVar63 >> 0xe) & 1);
      bVar20 = (bool)((byte)(uVar63 >> 0xf) & 1);
      *(uint *)pRVar1 = (uint)bVar49 * auVar69._0_4_ | (uint)!bVar49 * *(int *)pRVar1;
      *(uint *)(ray + 0x204) = (uint)bVar5 * auVar69._4_4_ | (uint)!bVar5 * *(int *)(ray + 0x204);
      *(uint *)(ray + 0x208) = (uint)bVar6 * auVar69._8_4_ | (uint)!bVar6 * *(int *)(ray + 0x208);
      *(uint *)(ray + 0x20c) = (uint)bVar7 * auVar69._12_4_ | (uint)!bVar7 * *(int *)(ray + 0x20c);
      *(uint *)(ray + 0x210) = (uint)bVar8 * auVar69._16_4_ | (uint)!bVar8 * *(int *)(ray + 0x210);
      *(uint *)(ray + 0x214) = (uint)bVar9 * auVar69._20_4_ | (uint)!bVar9 * *(int *)(ray + 0x214);
      *(uint *)(ray + 0x218) = (uint)bVar10 * auVar69._24_4_ | (uint)!bVar10 * *(int *)(ray + 0x218)
      ;
      *(uint *)(ray + 0x21c) = (uint)bVar11 * auVar69._28_4_ | (uint)!bVar11 * *(int *)(ray + 0x21c)
      ;
      *(uint *)(ray + 0x220) = (uint)bVar13 * auVar69._32_4_ | (uint)!bVar13 * *(int *)(ray + 0x220)
      ;
      *(uint *)(ray + 0x224) = (uint)bVar14 * auVar69._36_4_ | (uint)!bVar14 * *(int *)(ray + 0x224)
      ;
      *(uint *)(ray + 0x228) = (uint)bVar15 * auVar69._40_4_ | (uint)!bVar15 * *(int *)(ray + 0x228)
      ;
      *(uint *)(ray + 0x22c) = (uint)bVar16 * auVar69._44_4_ | (uint)!bVar16 * *(int *)(ray + 0x22c)
      ;
      *(uint *)(ray + 0x230) = (uint)bVar17 * auVar69._48_4_ | (uint)!bVar17 * *(int *)(ray + 0x230)
      ;
      *(uint *)(ray + 0x234) = (uint)bVar18 * auVar69._52_4_ | (uint)!bVar18 * *(int *)(ray + 0x234)
      ;
      *(uint *)(ray + 0x238) = (uint)bVar19 * auVar69._56_4_ | (uint)!bVar19 * *(int *)(ray + 0x238)
      ;
      *(uint *)(ray + 0x23c) = (uint)bVar20 * auVar69._60_4_ | (uint)!bVar20 * *(int *)(ray + 0x23c)
      ;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }